

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_functional_test.cc
# Opt level: O3

void iterator_seek_wal_only_test(void)

{
  fdb_encryption_key *pfVar1;
  fdb_status fVar2;
  fdb_kvs_handle *pfVar4;
  size_t sVar5;
  int iVar3;
  fdb_iterator **ppfVar6;
  size_t sVar7;
  size_t sVar8;
  fdb_file_handle **ptr_fhandle;
  btree *ptr_fhandle_00;
  fdb_kvs_handle *pfVar9;
  fdb_kvs_handle *pfVar10;
  ulong uVar11;
  long lVar12;
  fdb_kvs_handle **ptr_iterator;
  fdb_config **ptr_iterator_00;
  fdb_kvs_handle **ppfVar13;
  fdb_config *pfVar14;
  uint uVar15;
  fdb_kvs_handle **unaff_RBP;
  fdb_doc **doc;
  char *pcVar16;
  fdb_doc *doc_00;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 unaff_R12;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aVar17;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aVar18;
  fdb_kvs_handle *pfVar19;
  size_t unaff_R13;
  fdb_kvs_handle *pfVar20;
  fdb_config *pfVar21;
  char *doc_01;
  fdb_doc *rdoc;
  fdb_iterator *iterator;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *kv1;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  char keybuf [256];
  char bodybuf [256];
  char metabuf [256];
  fdb_config fconfig;
  fdb_iterator *pfStack_4198;
  fdb_kvs_handle *pfStack_4190;
  fdb_file_handle *pfStack_4188;
  fdb_doc *pfStack_4180;
  fdb_kvs_config fStack_4178;
  timeval tStack_4160;
  fdb_config fStack_4150;
  fdb_config *pfStack_4058;
  fdb_iterator *pfStack_4040;
  fdb_kvs_handle *pfStack_4038;
  fdb_doc *pfStack_4030;
  fdb_file_handle *pfStack_4028;
  fdb_kvs_config fStack_4020;
  timeval tStack_4008;
  fdb_config fStack_3ff8;
  fdb_config *pfStack_3f00;
  fdb_iterator *pfStack_3ee8;
  fdb_kvs_handle *pfStack_3ee0;
  fdb_file_handle *pfStack_3ed8;
  fdb_doc *pfStack_3ed0;
  uint64_t uStack_3ec8;
  undefined1 uStack_3ec0;
  undefined7 uStack_3eb8;
  undefined4 uStack_3eb1;
  undefined8 uStack_3ea8;
  undefined7 uStack_3ea0;
  undefined4 uStack_3e99;
  fdb_kvs_config fStack_3e90;
  timeval tStack_3e78;
  undefined4 uStack_3e68;
  undefined1 uStack_3e64;
  fdb_config fStack_3d60;
  char acStack_3c68 [256];
  fdb_config *pfStack_3b68;
  char *pcStack_3b60;
  code *pcStack_3b58;
  fdb_doc *pfStack_3b40;
  fdb_iterator *pfStack_3b38;
  fdb_kvs_handle *pfStack_3b30;
  fdb_file_handle *pfStack_3b28;
  fdb_kvs_config fStack_3b20;
  timeval tStack_3b08;
  fdb_config fStack_3af8;
  fdb_iterator **ppfStack_3a00;
  fdb_iterator *pfStack_39e8;
  fdb_doc *pfStack_39e0;
  fdb_kvs_handle *pfStack_39d8;
  fdb_file_handle *pfStack_39d0;
  timeval tStack_39c8;
  fdb_iterator *apfStack_39b8 [33];
  fdb_kvs_config fStack_38b0;
  char acStack_3898 [264];
  fdb_config fStack_3790;
  char acStack_3698 [256];
  fdb_kvs_handle *pfStack_3598;
  fdb_kvs_handle *pfStack_3590;
  fdb_doc **ppfStack_3588;
  fdb_doc **ppfStack_3580;
  fdb_doc **ppfStack_3578;
  fdb_kvs_handle *pfStack_3568;
  fdb_file_handle *pfStack_3560;
  fdb_iterator *pfStack_3558;
  fdb_doc *pfStack_3550;
  fdb_kvs_handle *pfStack_3548;
  fdb_doc *pfStack_3540;
  fdb_kvs_config fStack_3538;
  timeval tStack_3520;
  fdb_doc *apfStack_3510 [32];
  undefined1 auStack_3410 [272];
  uint8_t auStack_3300 [20];
  undefined4 uStack_32ec;
  undefined4 uStack_32e4;
  undefined1 uStack_32da;
  fdb_doc *apfStack_3210 [500];
  fdb_kvs_handle afStack_2270 [7];
  fdb_kvs_handle **ppfStack_12c8;
  fdb_kvs_handle *pfStack_12c0;
  fdb_doc **ppfStack_12b0;
  fdb_doc **ppfStack_12a8;
  fdb_doc **ppfStack_12a0;
  fdb_kvs_handle *pfStack_1290;
  fdb_iterator *pfStack_1288;
  fdb_iterator *pfStack_1280;
  fdb_kvs_handle *pfStack_1278;
  fdb_file_handle *pfStack_1270;
  fdb_doc *pfStack_1268;
  fdb_file_handle *pfStack_1260;
  undefined1 auStack_1258 [56];
  fdb_config fStack_1220;
  fdb_doc *apfStack_1128 [65];
  fdb_config **ppfStack_f20;
  btree *pbStack_f18;
  fdb_kvs_handle **ppfStack_f10;
  fdb_config *pfStack_f08;
  fdb_file_handle **ppfStack_f00;
  fdb_kvs_handle *pfStack_ef8;
  fdb_config *pfStack_ee8;
  fdb_config *pfStack_ee0;
  fdb_kvs_handle *pfStack_ed8;
  fdb_file_handle *pfStack_ed0;
  fdb_kvs_config fStack_ec8;
  fdb_doc *apfStack_eb0 [5];
  fdb_kvs_handle *apfStack_e88 [5];
  timeval tStack_e60;
  fdb_kvs_handle fStack_e50;
  fdb_config fStack_b50;
  fdb_kvs_handle **ppfStack_a58;
  btree *pbStack_a50;
  fdb_kvs_handle **ppfStack_a48;
  undefined8 *puStack_a40;
  undefined7 *puStack_a38;
  fdb_kvs_handle *pfStack_a30;
  fdb_kvs_handle *pfStack_a20;
  fdb_kvs_handle *pfStack_a18;
  fdb_kvs_handle *pfStack_a10;
  undefined7 uStack_a08;
  undefined4 uStack_a01;
  fdb_kvs_handle *pfStack_9f8;
  fdb_file_handle *pfStack_9f0;
  undefined1 auStack_9e8 [16];
  undefined7 uStack_9d8;
  undefined1 uStack_9d1;
  undefined7 uStack_9d0;
  undefined8 uStack_9c8;
  void *pvStack_9c0;
  undefined1 uStack_9b8;
  timeval tStack_9b0;
  undefined1 auStack_9a0 [40];
  fdb_file_handle *pfStack_978;
  undefined4 uStack_964;
  fdb_iterator **ppfStack_890;
  char *pcStack_888;
  fdb_kvs_handle *pfStack_880;
  char *pcStack_878;
  char *pcStack_870;
  code *pcStack_868;
  fdb_iterator *pfStack_858;
  fdb_iterator *pfStack_850;
  fdb_kvs_handle *pfStack_848;
  fdb_kvs_handle *pfStack_840;
  fdb_file_handle *pfStack_838;
  timeval tStack_830;
  fdb_kvs_config fStack_820;
  fdb_config fStack_808;
  char acStack_710 [256];
  char acStack_610 [264];
  fdb_kvs_handle *pfStack_508;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_500;
  size_t sStack_4f8;
  fdb_kvs_handle *pfStack_4f0;
  fdb_kvs_handle *pfStack_4e8;
  fdb_kvs_handle **ppfStack_4e0;
  undefined1 local_4d0 [16];
  fdb_kvs_handle *local_4c0;
  fdb_file_handle *local_4b8;
  fdb_kvs_handle *local_4b0;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 local_4a8 [11];
  undefined1 local_450 [40];
  fdb_kvs_handle local_428;
  fdb_config local_128;
  
  ppfStack_4e0 = (fdb_kvs_handle **)0x1197de;
  gettimeofday((timeval *)(local_450 + 0x18),(__timezone_ptr_t)0x0);
  ppfStack_4e0 = (fdb_kvs_handle **)0x1197e3;
  memleak_start();
  local_4d0._0_8_ = (fdb_kvs_handle *)0x0;
  ppfStack_4e0 = (fdb_kvs_handle **)0x1197f4;
  system("rm -rf  iterator_test* > errorlog.txt");
  ppfStack_4e0 = (fdb_kvs_handle **)0x119804;
  fdb_get_default_config();
  pfVar4 = (fdb_kvs_handle *)local_450;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119814;
  fdb_get_default_kvs_config();
  local_128.buffercache_size = 0;
  local_128.wal_threshold = 0x400;
  local_128.flags = 1;
  local_128.compaction_threshold = '\0';
  pfVar19 = (fdb_kvs_handle *)&local_4b8;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119842;
  fdb_open((fdb_file_handle **)pfVar19,"./iterator_test1",&local_128);
  pfVar9 = (fdb_kvs_handle *)&local_4c0;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119855;
  fdb_kvs_open_default(local_4b8,(fdb_kvs_handle **)pfVar9,(fdb_kvs_config *)pfVar4);
  ppfStack_4e0 = (fdb_kvs_handle **)0x11986b;
  fVar2 = fdb_set_log_callback(local_4c0,logCallbackFunc,"iterator_seek_wal_only_test");
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a3ef;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119891;
  fVar2 = fdb_kvs_open(local_4b8,&local_4b0,"kv1",(fdb_kvs_config *)local_450);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a3f4;
  unaff_R12.end_seqnum = 0;
  pfVar10 = (fdb_kvs_handle *)0x0;
  do {
    ppfStack_4e0 = (fdb_kvs_handle **)0x1198b9;
    sprintf((char *)&local_428,"kEy%d",(ulong)pfVar10 & 0xffffffff);
    ppfStack_4e0 = (fdb_kvs_handle **)0x1198d1;
    sprintf((char *)&local_428.bub_ctx.handle,"mEta%d",(ulong)pfVar10 & 0xffffffff);
    ppfStack_4e0 = (fdb_kvs_handle **)0x1198e9;
    sprintf((char *)&local_428.config.encryption_key,"bOdy%d",(ulong)pfVar10 & 0xffffffff);
    pfVar19 = (fdb_kvs_handle *)((long)local_4a8 + unaff_R12.end_seqnum);
    ppfStack_4e0 = (fdb_kvs_handle **)0x1198f9;
    unaff_R13 = strlen((char *)&local_428);
    unaff_RBP = &local_428.bub_ctx.handle;
    ppfStack_4e0 = (fdb_kvs_handle **)0x11990c;
    pfVar4 = (fdb_kvs_handle *)strlen((char *)unaff_RBP);
    ppfStack_4e0 = (fdb_kvs_handle **)0x11991c;
    sVar5 = strlen((char *)&local_428.config.encryption_key);
    ppfStack_4e0 = (fdb_kvs_handle **)0x119941;
    fdb_doc_create((fdb_doc **)pfVar19,&local_428,unaff_R13,unaff_RBP,(size_t)pfVar4,
                   &local_428.config.encryption_key,sVar5);
    ppfStack_4e0 = (fdb_kvs_handle **)0x119950;
    fVar2 = fdb_set(local_4b0,(fdb_doc *)local_4a8[(long)pfVar10]);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      ppfStack_4e0 = (fdb_kvs_handle **)0x11a3a3;
      iterator_seek_wal_only_test();
      goto LAB_0011a3a3;
    }
    ppfStack_4e0 = (fdb_kvs_handle **)0x119962;
    fdb_doc_free((fdb_doc *)local_4a8[(long)pfVar10]);
    pfVar10 = (fdb_kvs_handle *)&(pfVar10->kvs_config).field_0x1;
    unaff_R12.end_seqnum = unaff_R12.end_seqnum + 8;
  } while (pfVar10 != (fdb_kvs_handle *)0xa);
  unaff_R12.end_seqnum = 0;
  uVar11 = 0;
  do {
    ppfStack_4e0 = (fdb_kvs_handle **)0x119993;
    sprintf((char *)&local_428,"key%d",uVar11 & 0xffffffff);
    ppfStack_4e0 = (fdb_kvs_handle **)0x1199ab;
    sprintf((char *)&local_428.bub_ctx.handle,"meta%d",uVar11 & 0xffffffff);
    ppfStack_4e0 = (fdb_kvs_handle **)0x1199c3;
    sprintf((char *)&local_428.config.encryption_key,"body%d",uVar11 & 0xffffffff);
    pfVar19 = (fdb_kvs_handle *)((long)local_4a8 + unaff_R12.end_seqnum);
    ppfStack_4e0 = (fdb_kvs_handle **)0x1199d3;
    unaff_R13 = strlen((char *)&local_428);
    unaff_RBP = &local_428.bub_ctx.handle;
    ppfStack_4e0 = (fdb_kvs_handle **)0x1199e6;
    pfVar4 = (fdb_kvs_handle *)strlen((char *)unaff_RBP);
    ppfStack_4e0 = (fdb_kvs_handle **)0x1199f6;
    sVar5 = strlen((char *)&local_428.config.encryption_key);
    ppfStack_4e0 = (fdb_kvs_handle **)0x119a1b;
    fdb_doc_create((fdb_doc **)pfVar19,&local_428,unaff_R13,unaff_RBP,(size_t)pfVar4,
                   &local_428.config.encryption_key,sVar5);
    ppfStack_4e0 = (fdb_kvs_handle **)0x119a2a;
    fdb_set(local_4c0,(fdb_doc *)local_4a8[uVar11]);
    uVar11 = uVar11 + 1;
    unaff_R12.end_seqnum = unaff_R12.end_seqnum + 8;
  } while (uVar11 != 10);
  ppfStack_4e0 = (fdb_kvs_handle **)0x119a47;
  fdb_commit(local_4b8,'\0');
  ppfStack_4e0 = (fdb_kvs_handle **)0x119a6a;
  fdb_iterator_init(local_4c0,(fdb_iterator **)(local_4d0 + 8),(void *)0x0,0,(void *)0x0,0,0);
  ppfStack_4e0 = (fdb_kvs_handle **)0x119a77;
  fVar2 = fdb_iterator_get((fdb_iterator *)local_4d0._8_8_,(fdb_doc **)local_4d0);
  aVar17 = local_4a8[0];
  pfVar10 = (fdb_kvs_handle *)local_4d0._0_8_;
  pfVar9 = (fdb_kvs_handle *)(local_4d0 + 8);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a3f9;
  pfVar4 = *(fdb_kvs_handle **)(local_4d0._0_8_ + 0x20);
  pfVar19 = (fdb_kvs_handle *)
            (((atomic<unsigned_long> *)(local_4a8[0].end_seqnum + 0x20))->
            super___atomic_base<unsigned_long>)._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119aa0;
  iVar3 = bcmp(pfVar4,pfVar19,*(size_t *)(fdb_kvs_config *)local_4d0._0_8_);
  if (iVar3 != 0) goto LAB_0011a3fe;
  pfVar4 = *(fdb_kvs_handle **)((long)pfVar10 + 0x38);
  pfVar19 = (fdb_kvs_handle *)
            (((kvs_ops_stat *)(aVar17.end_seqnum + 0x38))->num_sets).
            super___atomic_base<unsigned_long>._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119ac0;
  iVar3 = bcmp(pfVar4,pfVar19,(size_t)(pfVar10->kvs_config).custom_cmp);
  if (iVar3 != 0) goto LAB_0011a409;
  pfVar4 = (fdb_kvs_handle *)
           ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar10 + 0x40))->seqtree;
  pfVar19 = (fdb_kvs_handle *)
            (((atomic<unsigned_long> *)(aVar17.end_seqnum + 0x40))->
            super___atomic_base<unsigned_long>)._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119ae0;
  iVar3 = bcmp(pfVar4,pfVar19,(size_t)(pfVar10->kvs_config).custom_cmp_param);
  if (iVar3 != 0) goto LAB_0011a414;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119af0;
  fdb_doc_free((fdb_doc *)pfVar10);
  pfVar10 = (fdb_kvs_handle *)local_4d0._8_8_;
  local_4d0._0_8_ = (fdb_kvs_handle *)0x0;
  pfVar4 = (fdb_kvs_handle *)
           (((atomic<unsigned_long> *)(local_4a8[2].end_seqnum + 0x20))->
           super___atomic_base<unsigned_long>)._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119b14;
  sVar5 = strlen((char *)&local_428);
  ppfStack_4e0 = (fdb_kvs_handle **)0x119b24;
  fVar2 = fdb_iterator_seek((fdb_iterator *)pfVar10,pfVar4,sVar5,'\0');
  if (fVar2 == FDB_RESULT_ITERATOR_FAIL) goto LAB_0011a41f;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119b3c;
  fVar2 = fdb_iterator_get((fdb_iterator *)local_4d0._8_8_,(fdb_doc **)local_4d0);
  aVar18 = local_4a8[2];
  pfVar9 = (fdb_kvs_handle *)local_4d0._0_8_;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a424;
  pfVar4 = *(fdb_kvs_handle **)(local_4d0._0_8_ + 0x20);
  pfVar19 = (fdb_kvs_handle *)
            (((atomic<unsigned_long> *)(local_4a8[2].end_seqnum + 0x20))->
            super___atomic_base<unsigned_long>)._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119b65;
  iVar3 = bcmp(pfVar4,pfVar19,*(size_t *)(fdb_kvs_config *)local_4d0._0_8_);
  if (iVar3 != 0) goto LAB_0011a429;
  pfVar4 = *(fdb_kvs_handle **)((long)pfVar9 + 0x38);
  pfVar19 = (fdb_kvs_handle *)
            (((kvs_ops_stat *)(aVar18.end_seqnum + 0x38))->num_sets).
            super___atomic_base<unsigned_long>._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119b85;
  iVar3 = bcmp(pfVar4,pfVar19,(size_t)(pfVar9->kvs_config).custom_cmp);
  if (iVar3 != 0) goto LAB_0011a434;
  pfVar4 = (fdb_kvs_handle *)
           ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar9 + 0x40))->seqtree;
  pfVar19 = (fdb_kvs_handle *)
            (((atomic<unsigned_long> *)(aVar18.end_seqnum + 0x40))->
            super___atomic_base<unsigned_long>)._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119ba5;
  iVar3 = bcmp(pfVar4,pfVar19,(size_t)(pfVar9->kvs_config).custom_cmp_param);
  if (iVar3 != 0) goto LAB_0011a43f;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119bb5;
  fdb_doc_free((fdb_doc *)pfVar9);
  local_4d0._0_8_ = (fdb_kvs_handle *)0x0;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119bc8;
  fVar2 = fdb_iterator_next((fdb_iterator *)local_4d0._8_8_);
  if (fVar2 == FDB_RESULT_ITERATOR_FAIL) goto LAB_0011a44a;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119be0;
  fVar2 = fdb_iterator_get((fdb_iterator *)local_4d0._8_8_,(fdb_doc **)local_4d0);
  aVar17 = local_4a8[3];
  pfVar10 = (fdb_kvs_handle *)local_4d0._0_8_;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a44f;
  pfVar4 = *(fdb_kvs_handle **)(local_4d0._0_8_ + 0x20);
  pfVar19 = (fdb_kvs_handle *)
            (((atomic<unsigned_long> *)(local_4a8[3].end_seqnum + 0x20))->
            super___atomic_base<unsigned_long>)._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119c09;
  iVar3 = bcmp(pfVar4,pfVar19,*(size_t *)(fdb_kvs_config *)local_4d0._0_8_);
  if (iVar3 != 0) goto LAB_0011a454;
  pfVar4 = *(fdb_kvs_handle **)((long)pfVar10 + 0x38);
  pfVar19 = (fdb_kvs_handle *)
            (((kvs_ops_stat *)(aVar17.end_seqnum + 0x38))->num_sets).
            super___atomic_base<unsigned_long>._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119c29;
  iVar3 = bcmp(pfVar4,pfVar19,(size_t)(pfVar10->kvs_config).custom_cmp);
  if (iVar3 != 0) goto LAB_0011a45f;
  pfVar4 = (fdb_kvs_handle *)
           ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar10 + 0x40))->seqtree;
  pfVar19 = (fdb_kvs_handle *)
            (((atomic<unsigned_long> *)(aVar17.end_seqnum + 0x40))->
            super___atomic_base<unsigned_long>)._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119c49;
  iVar3 = bcmp(pfVar4,pfVar19,(size_t)(pfVar10->kvs_config).custom_cmp_param);
  if (iVar3 != 0) goto LAB_0011a46a;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119c59;
  fdb_doc_free((fdb_doc *)pfVar10);
  pfVar10 = (fdb_kvs_handle *)local_4d0._8_8_;
  local_4d0._0_8_ = (fdb_kvs_handle *)0x0;
  pfVar4 = (fdb_kvs_handle *)
           (((atomic<unsigned_long> *)(local_4a8[9].end_seqnum + 0x20))->
           super___atomic_base<unsigned_long>)._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119c7d;
  sVar5 = strlen((char *)&local_428);
  ppfStack_4e0 = (fdb_kvs_handle **)0x119c8d;
  fVar2 = fdb_iterator_seek((fdb_iterator *)pfVar10,pfVar4,sVar5,'\0');
  if (fVar2 == FDB_RESULT_ITERATOR_FAIL) goto LAB_0011a475;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119ca5;
  fVar2 = fdb_iterator_get((fdb_iterator *)local_4d0._8_8_,(fdb_doc **)local_4d0);
  aVar18 = local_4a8[9];
  pfVar9 = (fdb_kvs_handle *)local_4d0._0_8_;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a47a;
  pfVar4 = *(fdb_kvs_handle **)(local_4d0._0_8_ + 0x20);
  pfVar19 = (fdb_kvs_handle *)
            (((atomic<unsigned_long> *)(local_4a8[9].end_seqnum + 0x20))->
            super___atomic_base<unsigned_long>)._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119cce;
  iVar3 = bcmp(pfVar4,pfVar19,*(size_t *)(fdb_kvs_config *)local_4d0._0_8_);
  if (iVar3 != 0) goto LAB_0011a47f;
  pfVar4 = *(fdb_kvs_handle **)((long)pfVar9 + 0x38);
  pfVar19 = (fdb_kvs_handle *)
            (((kvs_ops_stat *)(aVar18.end_seqnum + 0x38))->num_sets).
            super___atomic_base<unsigned_long>._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119cee;
  iVar3 = bcmp(pfVar4,pfVar19,(size_t)(pfVar9->kvs_config).custom_cmp);
  if (iVar3 != 0) goto LAB_0011a48a;
  pfVar4 = (fdb_kvs_handle *)
           ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar9 + 0x40))->seqtree;
  pfVar19 = (fdb_kvs_handle *)
            (((atomic<unsigned_long> *)(aVar18.end_seqnum + 0x40))->
            super___atomic_base<unsigned_long>)._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119d0e;
  iVar3 = bcmp(pfVar4,pfVar19,(size_t)(pfVar9->kvs_config).custom_cmp_param);
  if (iVar3 != 0) goto LAB_0011a495;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119d1e;
  fdb_doc_free((fdb_doc *)pfVar9);
  pfVar9 = (fdb_kvs_handle *)local_4d0._8_8_;
  local_4d0._0_8_ = (fdb_kvs_handle *)0x0;
  pfVar4 = (fdb_kvs_handle *)
           (((atomic<unsigned_long> *)(local_4a8[0].end_seqnum + 0x20))->
           super___atomic_base<unsigned_long>)._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119d42;
  sVar5 = strlen((char *)&local_428);
  ppfStack_4e0 = (fdb_kvs_handle **)0x119d52;
  fVar2 = fdb_iterator_seek((fdb_iterator *)pfVar9,pfVar4,sVar5,'\0');
  if (fVar2 == FDB_RESULT_ITERATOR_FAIL) goto LAB_0011a4a0;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119d6a;
  fVar2 = fdb_iterator_get((fdb_iterator *)local_4d0._8_8_,(fdb_doc **)local_4d0);
  unaff_R12 = local_4a8[0];
  pfVar10 = (fdb_kvs_handle *)local_4d0._0_8_;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a4a5;
  pfVar4 = *(fdb_kvs_handle **)(local_4d0._0_8_ + 0x20);
  pfVar19 = (fdb_kvs_handle *)
            (((atomic<unsigned_long> *)(local_4a8[0].end_seqnum + 0x20))->
            super___atomic_base<unsigned_long>)._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119d93;
  iVar3 = bcmp(pfVar4,pfVar19,*(size_t *)(fdb_kvs_config *)local_4d0._0_8_);
  if (iVar3 != 0) goto LAB_0011a4aa;
  pfVar4 = *(fdb_kvs_handle **)((long)pfVar10 + 0x38);
  pfVar19 = (fdb_kvs_handle *)
            (((kvs_ops_stat *)(unaff_R12.end_seqnum + 0x38))->num_sets).
            super___atomic_base<unsigned_long>._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119db3;
  iVar3 = bcmp(pfVar4,pfVar19,(size_t)(pfVar10->kvs_config).custom_cmp);
  if (iVar3 != 0) goto LAB_0011a4b5;
  pfVar4 = (fdb_kvs_handle *)
           ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar10 + 0x40))->seqtree;
  pfVar19 = (fdb_kvs_handle *)
            (((atomic<unsigned_long> *)(unaff_R12.end_seqnum + 0x40))->
            super___atomic_base<unsigned_long>)._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119dd3;
  iVar3 = bcmp(pfVar4,pfVar19,(size_t)(pfVar10->kvs_config).custom_cmp_param);
  if (iVar3 != 0) goto LAB_0011a4c0;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119de3;
  fdb_doc_free((fdb_doc *)pfVar10);
  pfVar10 = (fdb_kvs_handle *)local_4d0._8_8_;
  local_4d0._0_8_ = (fdb_kvs_handle *)0x0;
  pfVar4 = (fdb_kvs_handle *)
           (((atomic<unsigned_long> *)(local_4a8[2].end_seqnum + 0x20))->
           super___atomic_base<unsigned_long>)._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119e07;
  sVar5 = strlen((char *)&local_428);
  ppfStack_4e0 = (fdb_kvs_handle **)0x119e17;
  fVar2 = fdb_iterator_seek((fdb_iterator *)pfVar10,pfVar4,sVar5,'\0');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a4cb;
  unaff_R13 = 2;
  pfVar10 = (fdb_kvs_handle *)local_4d0;
  pfVar20 = pfVar4;
  do {
    ppfStack_4e0 = (fdb_kvs_handle **)0x119e37;
    fVar2 = fdb_iterator_get((fdb_iterator *)local_4d0._8_8_,(fdb_doc **)pfVar10);
    pfVar4 = (fdb_kvs_handle *)local_4d0._0_8_;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a3ae;
    pfVar19 = *(fdb_kvs_handle **)(local_4d0._0_8_ + 0x20);
    unaff_RBP = (fdb_kvs_handle **)local_4a8[unaff_R13].end_seqnum;
    unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP + 4);
    ppfStack_4e0 = (fdb_kvs_handle **)0x119e5f;
    iVar3 = bcmp(pfVar19,(void *)unaff_R12,*(size_t *)(fdb_kvs_config *)local_4d0._0_8_);
    if (iVar3 != 0) goto LAB_0011a3a3;
    pfVar19 = *(fdb_kvs_handle **)((long)pfVar4 + 0x38);
    unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP + 7);
    ppfStack_4e0 = (fdb_kvs_handle **)0x119e7e;
    iVar3 = bcmp(pfVar19,(void *)unaff_R12,(size_t)(pfVar4->kvs_config).custom_cmp);
    pfVar9 = pfVar10;
    if (iVar3 != 0) goto LAB_0011a3be;
    pfVar19 = (fdb_kvs_handle *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar4 + 0x40))->seqtree;
    unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP + 8);
    ppfStack_4e0 = (fdb_kvs_handle **)0x119e9d;
    iVar3 = bcmp(pfVar19,(void *)unaff_R12,(size_t)(pfVar4->kvs_config).custom_cmp_param);
    if (iVar3 != 0) goto LAB_0011a3b3;
    ppfStack_4e0 = (fdb_kvs_handle **)0x119ead;
    fdb_doc_free((fdb_doc *)pfVar4);
    local_4d0._0_8_ = (fdb_kvs_handle *)0x0;
    unaff_R13 = unaff_R13 + 1;
    ppfStack_4e0 = (fdb_kvs_handle **)0x119ec3;
    fVar2 = fdb_iterator_next((fdb_iterator *)local_4d0._8_8_);
    pfVar9 = (fdb_kvs_handle *)local_4d0._8_8_;
    pfVar20 = pfVar4;
  } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
  if (unaff_R13 != 10) goto LAB_0011a4d0;
  pfVar4 = (fdb_kvs_handle *)
           (((atomic<unsigned_long> *)(local_4a8[3].end_seqnum + 0x20))->
           super___atomic_base<unsigned_long>)._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119ef1;
  sVar5 = strlen((char *)&local_428);
  ppfStack_4e0 = (fdb_kvs_handle **)0x119f01;
  fVar2 = fdb_iterator_seek((fdb_iterator *)pfVar9,pfVar4,sVar5,'\0');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a4d5;
  unaff_R13 = 3;
  pfVar9 = (fdb_kvs_handle *)local_4d0;
  pfVar10 = pfVar4;
  do {
    ppfStack_4e0 = (fdb_kvs_handle **)0x119f21;
    fVar2 = fdb_iterator_get((fdb_iterator *)local_4d0._8_8_,(fdb_doc **)pfVar9);
    pfVar4 = (fdb_kvs_handle *)local_4d0._0_8_;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a3d4;
    pfVar19 = *(fdb_kvs_handle **)(local_4d0._0_8_ + 0x20);
    unaff_RBP = (fdb_kvs_handle **)local_4a8[unaff_R13].end_seqnum;
    unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP + 4);
    ppfStack_4e0 = (fdb_kvs_handle **)0x119f49;
    iVar3 = bcmp(pfVar19,(void *)unaff_R12,*(size_t *)(fdb_kvs_config *)local_4d0._0_8_);
    if (iVar3 != 0) goto LAB_0011a3c9;
    pfVar19 = *(fdb_kvs_handle **)((long)pfVar4 + 0x38);
    unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP + 7);
    ppfStack_4e0 = (fdb_kvs_handle **)0x119f68;
    iVar3 = bcmp(pfVar19,(void *)unaff_R12,(size_t)(pfVar4->kvs_config).custom_cmp);
    if (iVar3 != 0) goto LAB_0011a3e4;
    pfVar19 = (fdb_kvs_handle *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar4 + 0x40))->seqtree;
    unaff_R12 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP + 8);
    ppfStack_4e0 = (fdb_kvs_handle **)0x119f87;
    iVar3 = bcmp(pfVar19,(void *)unaff_R12,(size_t)(pfVar4->kvs_config).custom_cmp_param);
    if (iVar3 != 0) goto LAB_0011a3d9;
    ppfStack_4e0 = (fdb_kvs_handle **)0x119f97;
    fdb_doc_free((fdb_doc *)pfVar4);
    local_4d0._0_8_ = (fdb_kvs_handle *)0x0;
    unaff_R13 = unaff_R13 + 1;
    ppfStack_4e0 = (fdb_kvs_handle **)0x119fad;
    fVar2 = fdb_iterator_next((fdb_iterator *)local_4d0._8_8_);
    pfVar10 = pfVar4;
  } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
  if (unaff_R13 != 10) goto LAB_0011a4da;
  pfVar9 = (fdb_kvs_handle *)(local_4d0 + 8);
  ppfStack_4e0 = (fdb_kvs_handle **)0x119fcd;
  fdb_iterator_close((fdb_iterator *)local_4d0._8_8_);
  pfVar4 = &local_428;
  ppfStack_4e0 = (fdb_kvs_handle **)0x119fee;
  sprintf((char *)pfVar4,"key%d",4);
  unaff_R12.end_seqnum = (fdb_seqnum_t)&local_428.bub_ctx.handle;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a008;
  sprintf((char *)unaff_R12,"key%d",8);
  pfVar19 = local_4c0;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a015;
  unaff_R13 = strlen((char *)pfVar4);
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a020;
  sVar5 = strlen((char *)unaff_R12);
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a03e;
  fVar2 = fdb_iterator_init(pfVar19,(fdb_iterator **)pfVar9,pfVar4,unaff_R13,(void *)unaff_R12,sVar5
                            ,2);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a4df;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a050;
  fVar2 = fdb_iterator_seek_to_max((fdb_iterator *)local_4d0._8_8_);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a4e4;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a067;
  fVar2 = fdb_iterator_get((fdb_iterator *)local_4d0._8_8_,(fdb_doc **)local_4d0);
  pfVar10 = (fdb_kvs_handle *)local_4d0._0_8_;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a4e9;
  pfVar4 = *(fdb_kvs_handle **)(local_4d0._0_8_ + 0x20);
  pfVar19 = (fdb_kvs_handle *)
            (((atomic<unsigned_long> *)(local_4a8[8].end_seqnum + 0x20))->
            super___atomic_base<unsigned_long>)._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a090;
  iVar3 = bcmp(pfVar4,pfVar19,*(size_t *)(fdb_kvs_config *)local_4d0._0_8_);
  unaff_R12 = local_4a8[8];
  if (iVar3 != 0) goto LAB_0011a4ee;
  pfVar4 = *(fdb_kvs_handle **)((long)pfVar10 + 0x38);
  pfVar19 = (fdb_kvs_handle *)
            (((kvs_ops_stat *)(local_4a8[8].end_seqnum + 0x38))->num_sets).
            super___atomic_base<unsigned_long>._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a0b0;
  iVar3 = bcmp(pfVar4,pfVar19,(size_t)(pfVar10->kvs_config).custom_cmp);
  if (iVar3 != 0) goto LAB_0011a4f9;
  pfVar4 = (fdb_kvs_handle *)
           ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar10 + 0x40))->seqtree;
  pfVar19 = (fdb_kvs_handle *)
            (((atomic<unsigned_long> *)(local_4a8[8].end_seqnum + 0x40))->
            super___atomic_base<unsigned_long>)._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a0d0;
  iVar3 = bcmp(pfVar4,pfVar19,(size_t)(pfVar10->kvs_config).custom_cmp_param);
  if (iVar3 != 0) goto LAB_0011a504;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a0e0;
  fdb_doc_free((fdb_doc *)pfVar10);
  local_4d0._0_8_ = (fdb_kvs_handle *)0x0;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a0f3;
  fVar2 = fdb_iterator_seek_to_min((fdb_iterator *)local_4d0._8_8_);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a50f;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a10a;
  fVar2 = fdb_iterator_get((fdb_iterator *)local_4d0._8_8_,(fdb_doc **)local_4d0);
  pfVar9 = (fdb_kvs_handle *)local_4d0._0_8_;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a514;
  pfVar4 = *(fdb_kvs_handle **)(local_4d0._0_8_ + 0x20);
  pfVar19 = (fdb_kvs_handle *)
            (((atomic<unsigned_long> *)(local_4a8[4].end_seqnum + 0x20))->
            super___atomic_base<unsigned_long>)._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a133;
  iVar3 = bcmp(pfVar4,pfVar19,*(size_t *)(fdb_kvs_config *)local_4d0._0_8_);
  unaff_R12 = local_4a8[4];
  if (iVar3 != 0) goto LAB_0011a519;
  pfVar4 = *(fdb_kvs_handle **)((long)pfVar9 + 0x38);
  pfVar19 = (fdb_kvs_handle *)
            (((kvs_ops_stat *)(local_4a8[4].end_seqnum + 0x38))->num_sets).
            super___atomic_base<unsigned_long>._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a153;
  iVar3 = bcmp(pfVar4,pfVar19,(size_t)(pfVar9->kvs_config).custom_cmp);
  if (iVar3 != 0) goto LAB_0011a524;
  pfVar4 = (fdb_kvs_handle *)
           ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar9 + 0x40))->seqtree;
  pfVar19 = (fdb_kvs_handle *)
            (((atomic<unsigned_long> *)(local_4a8[4].end_seqnum + 0x40))->
            super___atomic_base<unsigned_long>)._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a173;
  iVar3 = bcmp(pfVar4,pfVar19,(size_t)(pfVar9->kvs_config).custom_cmp_param);
  if (iVar3 != 0) goto LAB_0011a52f;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a183;
  fdb_doc_free((fdb_doc *)pfVar9);
  local_4d0._0_8_ = (fdb_kvs_handle *)0x0;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a196;
  fVar2 = fdb_iterator_close((fdb_iterator *)local_4d0._8_8_);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a53a;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a1be;
  fVar2 = fdb_iterator_init(local_4c0,(fdb_iterator **)(local_4d0 + 8),(void *)0x0,0,(void *)0x0,0,0
                           );
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a53f;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a1d0;
  fVar2 = fdb_iterator_seek_to_max((fdb_iterator *)local_4d0._8_8_);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a544;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a1e7;
  fVar2 = fdb_iterator_get((fdb_iterator *)local_4d0._8_8_,(fdb_doc **)local_4d0);
  pfVar10 = (fdb_kvs_handle *)local_4d0._0_8_;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a549;
  pfVar4 = *(fdb_kvs_handle **)(local_4d0._0_8_ + 0x20);
  pfVar19 = (fdb_kvs_handle *)
            (((atomic<unsigned_long> *)(local_4a8[9].end_seqnum + 0x20))->
            super___atomic_base<unsigned_long>)._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a210;
  iVar3 = bcmp(pfVar4,pfVar19,*(size_t *)(fdb_kvs_config *)local_4d0._0_8_);
  unaff_R12 = local_4a8[9];
  if (iVar3 != 0) goto LAB_0011a54e;
  pfVar4 = *(fdb_kvs_handle **)((long)pfVar10 + 0x38);
  pfVar19 = (fdb_kvs_handle *)
            (((kvs_ops_stat *)(local_4a8[9].end_seqnum + 0x38))->num_sets).
            super___atomic_base<unsigned_long>._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a230;
  iVar3 = bcmp(pfVar4,pfVar19,(size_t)(pfVar10->kvs_config).custom_cmp);
  if (iVar3 != 0) goto LAB_0011a559;
  pfVar4 = (fdb_kvs_handle *)
           ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar10 + 0x40))->seqtree;
  pfVar19 = (fdb_kvs_handle *)
            (((atomic<unsigned_long> *)(local_4a8[9].end_seqnum + 0x40))->
            super___atomic_base<unsigned_long>)._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a250;
  iVar3 = bcmp(pfVar4,pfVar19,(size_t)(pfVar10->kvs_config).custom_cmp_param);
  if (iVar3 != 0) goto LAB_0011a564;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a260;
  fdb_doc_free((fdb_doc *)pfVar10);
  local_4d0._0_8_ = (fdb_kvs_handle *)0x0;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a273;
  fVar2 = fdb_iterator_seek_to_min((fdb_iterator *)local_4d0._8_8_);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a56f;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a28a;
  fVar2 = fdb_iterator_get((fdb_iterator *)local_4d0._8_8_,(fdb_doc **)local_4d0);
  pfVar9 = (fdb_kvs_handle *)local_4d0._0_8_;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a574;
  pfVar4 = *(fdb_kvs_handle **)(local_4d0._0_8_ + 0x20);
  pfVar19 = (fdb_kvs_handle *)
            (((atomic<unsigned_long> *)(local_4a8[0].end_seqnum + 0x20))->
            super___atomic_base<unsigned_long>)._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a2b3;
  iVar3 = bcmp(pfVar4,pfVar19,*(size_t *)(fdb_kvs_config *)local_4d0._0_8_);
  unaff_R12 = local_4a8[0];
  if (iVar3 != 0) goto LAB_0011a579;
  pfVar4 = *(fdb_kvs_handle **)((long)pfVar9 + 0x38);
  pfVar19 = (fdb_kvs_handle *)
            (((kvs_ops_stat *)(local_4a8[0].end_seqnum + 0x38))->num_sets).
            super___atomic_base<unsigned_long>._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a2d3;
  iVar3 = bcmp(pfVar4,pfVar19,(size_t)(pfVar9->kvs_config).custom_cmp);
  if (iVar3 != 0) goto LAB_0011a584;
  pfVar4 = (fdb_kvs_handle *)
           ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar9 + 0x40))->seqtree;
  pfVar19 = (fdb_kvs_handle *)
            (((atomic<unsigned_long> *)(local_4a8[0].end_seqnum + 0x40))->
            super___atomic_base<unsigned_long>)._M_i;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a2f3;
  iVar3 = bcmp(pfVar4,pfVar19,(size_t)(pfVar9->kvs_config).custom_cmp_param);
  if (iVar3 != 0) goto LAB_0011a58f;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a303;
  fdb_doc_free((fdb_doc *)pfVar9);
  local_4d0._0_8_ = (fdb_kvs_handle *)0x0;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a316;
  fVar2 = fdb_iterator_close((fdb_iterator *)local_4d0._8_8_);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    ppfStack_4e0 = (fdb_kvs_handle **)0x11a328;
    fdb_kvs_close(local_4b0);
    ppfStack_4e0 = (fdb_kvs_handle **)0x11a332;
    fdb_kvs_close(local_4c0);
    ppfStack_4e0 = (fdb_kvs_handle **)0x11a33c;
    fdb_close(local_4b8);
    lVar12 = 0;
    do {
      ppfStack_4e0 = (fdb_kvs_handle **)0x11a348;
      fdb_doc_free((fdb_doc *)local_4a8[lVar12]);
      lVar12 = lVar12 + 1;
    } while (lVar12 != 10);
    ppfStack_4e0 = (fdb_kvs_handle **)0x11a356;
    fdb_shutdown();
    ppfStack_4e0 = (fdb_kvs_handle **)0x11a35b;
    memleak_end();
    pcVar16 = "%s PASSED\n";
    if (iterator_seek_wal_only_test()::__test_pass != '\0') {
      pcVar16 = "%s FAILED\n";
    }
    ppfStack_4e0 = (fdb_kvs_handle **)0x11a38c;
    fprintf(_stderr,pcVar16,"iterator seek wal only test");
    return;
  }
  goto LAB_0011a59a;
LAB_0011a830:
  pcStack_868 = (code *)0x11a835;
  iterator_after_wal_threshold();
  goto LAB_0011a835;
LAB_0011acdb:
  pfStack_a30 = (fdb_kvs_handle *)0x11ace0;
  iterator_manual_wal_flush();
LAB_0011ace0:
  ptr_iterator = &pfStack_a18;
  pfStack_a30 = (fdb_kvs_handle *)0x11ace5;
  iterator_manual_wal_flush();
  goto LAB_0011ace5;
LAB_0011b2d3:
  pfStack_ef8 = (fdb_kvs_handle *)0x11b2de;
  sequence_iterator_seek_test();
  pfVar21 = pfVar14;
LAB_0011b2de:
  pfVar14 = pfVar21;
  pfStack_ef8 = (fdb_kvs_handle *)0x11b2e3;
  sequence_iterator_seek_test();
LAB_0011b2e3:
  pfStack_ef8 = (fdb_kvs_handle *)0x11b2ee;
  sequence_iterator_seek_test();
LAB_0011b2ee:
  pfStack_ef8 = (fdb_kvs_handle *)0x11b2f9;
  sequence_iterator_seek_test();
LAB_0011b2f9:
  pfStack_ef8 = (fdb_kvs_handle *)0x11b304;
  sequence_iterator_seek_test();
  pfVar21 = pfVar14;
  goto LAB_0011b304;
LAB_0011b623:
  ppfVar13 = &pfStack_1290;
  ppfStack_12a0 = (fdb_doc **)0x11b628;
  iterator_concurrent_compaction();
  goto LAB_0011b628;
LAB_0011bb51:
  ppfStack_3578 = (fdb_doc **)0x11bb56;
  iterator_offset_access_test();
LAB_0011bb56:
  ppfStack_3578 = (fdb_doc **)0x11bb5b;
  iterator_offset_access_test();
LAB_0011bb5b:
  ppfStack_3578 = (fdb_doc **)0x11bb60;
  iterator_offset_access_test();
LAB_0011bb60:
  ppfStack_3578 = (fdb_doc **)0x11bb65;
  iterator_offset_access_test();
LAB_0011bb65:
  ppfStack_3578 = (fdb_doc **)0x11bb6a;
  iterator_offset_access_test();
LAB_0011bb6a:
  ppfStack_3578 = (fdb_doc **)0x11bb6f;
  iterator_offset_access_test();
LAB_0011bb6f:
  ppfStack_3578 = (fdb_doc **)0x11bb74;
  iterator_offset_access_test();
  goto LAB_0011bb74;
LAB_0011a3a3:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a3ae;
  iterator_seek_wal_only_test();
  pfVar20 = pfVar4;
LAB_0011a3ae:
  pfVar4 = pfVar20;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a3b3;
  iterator_seek_wal_only_test();
  pfVar9 = pfVar10;
LAB_0011a3b3:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a3be;
  iterator_seek_wal_only_test();
LAB_0011a3be:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a3c9;
  iterator_seek_wal_only_test();
LAB_0011a3c9:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a3d4;
  iterator_seek_wal_only_test();
  pfVar10 = pfVar4;
LAB_0011a3d4:
  pfVar4 = pfVar10;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a3d9;
  iterator_seek_wal_only_test();
LAB_0011a3d9:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a3e4;
  iterator_seek_wal_only_test();
LAB_0011a3e4:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a3ef;
  iterator_seek_wal_only_test();
LAB_0011a3ef:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a3f4;
  iterator_seek_wal_only_test();
LAB_0011a3f4:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a3f9;
  iterator_seek_wal_only_test();
LAB_0011a3f9:
  aVar17 = unaff_R12;
  pfVar10 = pfVar9;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a3fe;
  iterator_seek_wal_only_test();
LAB_0011a3fe:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a409;
  iterator_seek_wal_only_test();
LAB_0011a409:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a414;
  iterator_seek_wal_only_test();
LAB_0011a414:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a41f;
  iterator_seek_wal_only_test();
LAB_0011a41f:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a424;
  iterator_seek_wal_only_test();
LAB_0011a424:
  aVar18 = aVar17;
  pfVar9 = pfVar10;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a429;
  iterator_seek_wal_only_test();
LAB_0011a429:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a434;
  iterator_seek_wal_only_test();
LAB_0011a434:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a43f;
  iterator_seek_wal_only_test();
LAB_0011a43f:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a44a;
  iterator_seek_wal_only_test();
LAB_0011a44a:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a44f;
  iterator_seek_wal_only_test();
LAB_0011a44f:
  aVar17 = aVar18;
  pfVar10 = pfVar9;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a454;
  iterator_seek_wal_only_test();
LAB_0011a454:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a45f;
  iterator_seek_wal_only_test();
LAB_0011a45f:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a46a;
  iterator_seek_wal_only_test();
LAB_0011a46a:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a475;
  iterator_seek_wal_only_test();
LAB_0011a475:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a47a;
  iterator_seek_wal_only_test();
LAB_0011a47a:
  aVar18 = aVar17;
  pfVar9 = pfVar10;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a47f;
  iterator_seek_wal_only_test();
LAB_0011a47f:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a48a;
  iterator_seek_wal_only_test();
LAB_0011a48a:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a495;
  iterator_seek_wal_only_test();
LAB_0011a495:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a4a0;
  iterator_seek_wal_only_test();
LAB_0011a4a0:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a4a5;
  iterator_seek_wal_only_test();
LAB_0011a4a5:
  unaff_R12 = aVar18;
  pfVar10 = pfVar9;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a4aa;
  iterator_seek_wal_only_test();
LAB_0011a4aa:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a4b5;
  iterator_seek_wal_only_test();
LAB_0011a4b5:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a4c0;
  iterator_seek_wal_only_test();
LAB_0011a4c0:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a4cb;
  iterator_seek_wal_only_test();
LAB_0011a4cb:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a4d0;
  iterator_seek_wal_only_test();
LAB_0011a4d0:
  pfVar9 = pfVar10;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a4d5;
  iterator_seek_wal_only_test();
LAB_0011a4d5:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a4da;
  iterator_seek_wal_only_test();
LAB_0011a4da:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a4df;
  iterator_seek_wal_only_test();
LAB_0011a4df:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a4e4;
  iterator_seek_wal_only_test();
LAB_0011a4e4:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a4e9;
  iterator_seek_wal_only_test();
LAB_0011a4e9:
  pfVar10 = pfVar9;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a4ee;
  iterator_seek_wal_only_test();
LAB_0011a4ee:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a4f9;
  iterator_seek_wal_only_test();
LAB_0011a4f9:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a504;
  iterator_seek_wal_only_test();
LAB_0011a504:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a50f;
  iterator_seek_wal_only_test();
LAB_0011a50f:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a514;
  iterator_seek_wal_only_test();
LAB_0011a514:
  pfVar9 = pfVar10;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a519;
  iterator_seek_wal_only_test();
LAB_0011a519:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a524;
  iterator_seek_wal_only_test();
LAB_0011a524:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a52f;
  iterator_seek_wal_only_test();
LAB_0011a52f:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a53a;
  iterator_seek_wal_only_test();
LAB_0011a53a:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a53f;
  iterator_seek_wal_only_test();
LAB_0011a53f:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a544;
  iterator_seek_wal_only_test();
LAB_0011a544:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a549;
  iterator_seek_wal_only_test();
LAB_0011a549:
  pfVar10 = pfVar9;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a54e;
  iterator_seek_wal_only_test();
LAB_0011a54e:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a559;
  iterator_seek_wal_only_test();
LAB_0011a559:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a564;
  iterator_seek_wal_only_test();
LAB_0011a564:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a56f;
  iterator_seek_wal_only_test();
LAB_0011a56f:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a574;
  iterator_seek_wal_only_test();
LAB_0011a574:
  pfVar9 = pfVar10;
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a579;
  iterator_seek_wal_only_test();
LAB_0011a579:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a584;
  iterator_seek_wal_only_test();
LAB_0011a584:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a58f;
  iterator_seek_wal_only_test();
LAB_0011a58f:
  ppfStack_4e0 = (fdb_kvs_handle **)0x11a59a;
  iterator_seek_wal_only_test();
LAB_0011a59a:
  ppfStack_4e0 = (fdb_kvs_handle **)iterator_after_wal_threshold;
  iterator_seek_wal_only_test();
  pcStack_868 = (code *)0x11a5bc;
  pfStack_508 = pfVar9;
  aStack_500 = unaff_R12;
  sStack_4f8 = unaff_R13;
  pfStack_4f0 = pfVar4;
  pfStack_4e8 = pfVar19;
  ppfStack_4e0 = unaff_RBP;
  gettimeofday(&tStack_830,(__timezone_ptr_t)0x0);
  pcStack_868 = (code *)0x11a5c1;
  memleak_start();
  pfStack_858 = (fdb_iterator *)0x0;
  pcStack_868 = (code *)0x11a5d7;
  fdb_get_default_config();
  pcStack_868 = (code *)0x11a5e4;
  fdb_get_default_kvs_config();
  fStack_808.wal_threshold = 10;
  fStack_808.flags = 1;
  fStack_808.seqtree_opt = '\x01';
  pcStack_868 = (code *)0x11a605;
  system("rm -rf  iterator_test* > errorlog.txt");
  pcStack_868 = (code *)0x11a61c;
  fdb_open(&pfStack_838,"./iterator_test1",&fStack_808);
  pcStack_868 = (code *)0x11a633;
  fdb_kvs_open(pfStack_838,&pfStack_848,"db1",&fStack_820);
  pcStack_868 = (code *)0x11a64a;
  fdb_kvs_open(pfStack_838,&pfStack_840,"db2",&fStack_820);
  uVar11 = 0;
  do {
    pcStack_868 = (code *)0x11a676;
    sprintf(acStack_610,"key%d",uVar11);
    pcStack_868 = (code *)0x11a685;
    sprintf(acStack_710,"body%d",uVar11);
    pfVar19 = pfStack_848;
    pcStack_868 = (code *)0x11a692;
    ppfVar6 = (fdb_iterator **)strlen(acStack_610);
    pcStack_868 = (code *)0x11a69d;
    sVar5 = strlen(acStack_710);
    pcStack_868 = (code *)0x11a6b1;
    fdb_set_kv(pfVar19,acStack_610,(size_t)ppfVar6,acStack_710,sVar5);
    uVar15 = (int)uVar11 + 1;
    uVar11 = (ulong)uVar15;
  } while (uVar15 != 6);
  pcStack_868 = (code *)0x11a6ce;
  fVar2 = fdb_iterator_sequence_init(pfStack_848,&pfStack_850,0,0,0);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    do {
      pcStack_868 = (code *)0x11a6e8;
      fVar2 = fdb_iterator_get(pfStack_850,(fdb_doc **)&pfStack_858);
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011a82b:
        pcStack_868 = (code *)0x11a830;
        iterator_after_wal_threshold();
        goto LAB_0011a830;
      }
      pcStack_868 = (code *)0x11a70b;
      fVar2 = fdb_set_kv(pfStack_840,(void *)pfStack_858->_seqnum,(size_t)pfStack_858->handle,
                         (void *)0x0,0);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pcStack_868 = (code *)0x11a82b;
        iterator_after_wal_threshold();
        goto LAB_0011a82b;
      }
      pcStack_868 = (code *)0x11a71d;
      fdb_doc_free((fdb_doc *)pfStack_858);
      pfStack_858 = (fdb_iterator *)0x0;
      pcStack_868 = (code *)0x11a730;
      fVar2 = fdb_iterator_next(pfStack_850);
    } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
    ppfVar6 = &pfStack_850;
    pcStack_868 = (code *)0x11a742;
    fdb_iterator_close(pfStack_850);
    pcStack_868 = (code *)0x11a756;
    fVar2 = fdb_iterator_sequence_init(pfStack_848,ppfVar6,0,0,0);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      while( true ) {
        pcStack_868 = (code *)0x11a770;
        fVar2 = fdb_iterator_get(pfStack_850,(fdb_doc **)&pfStack_858);
        if (fVar2 != FDB_RESULT_SUCCESS) break;
        pcStack_868 = (code *)0x11a787;
        fVar2 = fdb_get(pfStack_848,(fdb_doc *)pfStack_858);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a830;
        pcStack_868 = (code *)0x11a799;
        fdb_doc_free((fdb_doc *)pfStack_858);
        pfStack_858 = (fdb_iterator *)0x0;
        pcStack_868 = (code *)0x11a7ac;
        fVar2 = fdb_iterator_next(pfStack_850);
        if (fVar2 == FDB_RESULT_ITERATOR_FAIL) {
          pcStack_868 = (code *)0x11a7bb;
          fdb_iterator_close(pfStack_850);
          pcStack_868 = (code *)0x11a7c5;
          fdb_kvs_close(pfStack_848);
          pcStack_868 = (code *)0x11a7cf;
          fdb_kvs_close(pfStack_840);
          pcStack_868 = (code *)0x11a7d9;
          fdb_close(pfStack_838);
          pcStack_868 = (code *)0x11a7de;
          fdb_shutdown();
          pcStack_868 = (code *)0x11a7e3;
          memleak_end();
          pcVar16 = "%s PASSED\n";
          if (iterator_after_wal_threshold()::__test_pass != '\0') {
            pcVar16 = "%s FAILED\n";
          }
          pcStack_868 = (code *)0x11a814;
          fprintf(_stderr,pcVar16,"iterator after wal threshold");
          return;
        }
      }
LAB_0011a835:
      ppfVar6 = &pfStack_858;
      pcStack_868 = (code *)0x11a83a;
      iterator_after_wal_threshold();
      goto LAB_0011a83a;
    }
  }
  else {
LAB_0011a83a:
    pcStack_868 = (code *)0x11a83f;
    iterator_after_wal_threshold();
  }
  pcStack_868 = iterator_manual_wal_flush;
  iterator_after_wal_threshold();
  pcStack_870 = "body%d";
  pfStack_880 = pfVar19;
  pfStack_a30 = (fdb_kvs_handle *)0x11a861;
  ppfStack_890 = ppfVar6;
  pcStack_888 = acStack_710;
  pcStack_878 = acStack_610;
  pcStack_868 = (code *)uVar11;
  gettimeofday(&tStack_9b0,(__timezone_ptr_t)0x0);
  pfStack_a30 = (fdb_kvs_handle *)0x11a866;
  memleak_start();
  uStack_9d0 = 0x3106002d;
  uStack_9d8 = 0x3032343e3e0508;
  uStack_9d1 = 0x31;
  uStack_9c8._0_2_ = 0x508;
  uStack_9c8._2_6_ = 0x313032343e3e;
  pvStack_9c0 = (void *)0x323106002d31;
  uStack_9b8 = 0;
  ptr_iterator = (fdb_kvs_handle **)auStack_9e8;
  auStack_9e8._0_7_ = 0x3931343e3e0508;
  auStack_9e8._7_4_ = 0x2d3939;
  uStack_a08 = 0x3433343e3e0508;
  uStack_a01 = 0x140a35;
  pfStack_a18 = (fdb_kvs_handle *)0x0;
  pfStack_a30 = (fdb_kvs_handle *)0x11a8e4;
  fdb_get_default_config();
  pfVar19 = (fdb_kvs_handle *)auStack_9a0;
  pfStack_a30 = (fdb_kvs_handle *)0x11a8f4;
  fdb_get_default_kvs_config();
  pfStack_978 = (fdb_file_handle *)0x400;
  uStack_964 = 1;
  pfStack_a30 = (fdb_kvs_handle *)0x11a910;
  system("rm -rf  iterator_test* > errorlog.txt");
  ptr_fhandle_00 = (btree *)&pfStack_9f0;
  pfStack_a30 = (fdb_kvs_handle *)0x11a927;
  fdb_open((fdb_file_handle **)ptr_fhandle_00,"./iterator_test1",(fdb_config *)(auStack_9a0 + 0x18))
  ;
  ppfVar13 = &pfStack_9f8;
  pfStack_a30 = (fdb_kvs_handle *)0x11a942;
  fdb_kvs_open(pfStack_9f0,ppfVar13,"db1",(fdb_kvs_config *)pfVar19);
  pfStack_a30 = (fdb_kvs_handle *)0x11a95a;
  fdb_kvs_open(pfStack_9f0,&pfStack_a10,"db2",(fdb_kvs_config *)pfVar19);
  pfStack_a30 = (fdb_kvs_handle *)0x11a970;
  fdb_set_kv(pfStack_9f8,&uStack_9d8,0xf,(void *)0x0,0);
  pfStack_a30 = (fdb_kvs_handle *)0x11a986;
  fdb_set_kv(pfStack_9f8,&uStack_9c8,0x11,(void *)0x0,0);
  pfStack_a30 = (fdb_kvs_handle *)0x11a991;
  fdb_commit(pfStack_9f0,'\0');
  pfStack_a30 = (fdb_kvs_handle *)0x11a9b4;
  pfVar9 = pfStack_9f8;
  fVar2 = fdb_iterator_init(pfStack_9f8,(fdb_iterator **)&pfStack_a20,ptr_iterator,0xb,(void *)0x0,0
                            ,0);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    do {
      pfStack_a30 = (fdb_kvs_handle *)0x11a9ce;
      pfVar9 = pfStack_a20;
      fVar2 = fdb_iterator_get((fdb_iterator *)pfStack_a20,(fdb_doc **)&pfStack_a18);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_a30 = (fdb_kvs_handle *)0x11acdb;
        iterator_manual_wal_flush();
        goto LAB_0011acdb;
      }
      pfStack_a30 = (fdb_kvs_handle *)0x11a9e0;
      fdb_doc_free((fdb_doc *)pfStack_a18);
      pfStack_a18 = (fdb_kvs_handle *)0x0;
      pfStack_a30 = (fdb_kvs_handle *)0x11a9f3;
      fVar2 = fdb_iterator_next((fdb_iterator *)pfStack_a20);
    } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
    ptr_iterator = &pfStack_a20;
    pfStack_a30 = (fdb_kvs_handle *)0x11aa05;
    fdb_iterator_close((fdb_iterator *)pfStack_a20);
    pfStack_a30 = (fdb_kvs_handle *)0x11aa29;
    pfVar9 = pfStack_9f8;
    fVar2 = fdb_iterator_init(pfStack_9f8,(fdb_iterator **)ptr_iterator,&uStack_a08,0xb,(void *)0x0,
                              0,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011acea;
    pfStack_a30 = (fdb_kvs_handle *)0x11aa40;
    pfVar9 = pfStack_a20;
    fVar2 = fdb_iterator_get((fdb_iterator *)pfStack_a20,(fdb_doc **)&pfStack_a18);
    if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011acef;
    ptr_iterator = &pfStack_a20;
    pfStack_a30 = (fdb_kvs_handle *)0x11aa55;
    fdb_iterator_close((fdb_iterator *)pfStack_a20);
    pfStack_a30 = (fdb_kvs_handle *)0x11aa6e;
    fdb_set_kv(pfStack_a10,&uStack_9d8,0xf,(void *)0x0,0);
    pfStack_a30 = (fdb_kvs_handle *)0x11aa87;
    fdb_set_kv(pfStack_a10,&uStack_9c8,0x11,(void *)0x0,0);
    pfStack_a30 = (fdb_kvs_handle *)0x11aa96;
    fdb_commit(pfStack_9f0,'\x01');
    pfStack_a30 = (fdb_kvs_handle *)0x11aaba;
    pfVar9 = pfStack_a10;
    fVar2 = fdb_iterator_init(pfStack_a10,(fdb_iterator **)ptr_iterator,auStack_9e8,0xb,(void *)0x0,
                              0,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011acf4;
    do {
      pfStack_a30 = (fdb_kvs_handle *)0x11aad4;
      pfVar9 = pfStack_a20;
      fVar2 = fdb_iterator_get((fdb_iterator *)pfStack_a20,(fdb_doc **)&pfStack_a18);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011acdb;
      pfStack_a30 = (fdb_kvs_handle *)0x11aae6;
      fdb_doc_free((fdb_doc *)pfStack_a18);
      pfStack_a18 = (fdb_kvs_handle *)0x0;
      pfStack_a30 = (fdb_kvs_handle *)0x11aaf9;
      fVar2 = fdb_iterator_next((fdb_iterator *)pfStack_a20);
    } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
    ptr_iterator = &pfStack_a20;
    pfStack_a30 = (fdb_kvs_handle *)0x11ab0b;
    fdb_iterator_close((fdb_iterator *)pfStack_a20);
    pfStack_a30 = (fdb_kvs_handle *)0x11ab2f;
    pfVar9 = pfStack_9f8;
    fVar2 = fdb_iterator_init(pfStack_9f8,(fdb_iterator **)ptr_iterator,&uStack_a08,0xb,(void *)0x0,
                              0,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011acf9;
    pfStack_a30 = (fdb_kvs_handle *)0x11ab46;
    pfVar9 = pfStack_a20;
    fVar2 = fdb_iterator_get((fdb_iterator *)pfStack_a20,(fdb_doc **)&pfStack_a18);
    if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011acfe;
    ptr_iterator = &pfStack_a20;
    pfStack_a30 = (fdb_kvs_handle *)0x11ab5b;
    fdb_iterator_close((fdb_iterator *)pfStack_a20);
    pfStack_a30 = (fdb_kvs_handle *)0x11ab7e;
    fVar2 = fdb_iterator_init(pfStack_a10,(fdb_iterator **)ptr_iterator,(void *)0x0,0,auStack_9e8,
                              0xb,0);
    pfVar9 = pfStack_a10;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ad03;
    pfStack_a30 = (fdb_kvs_handle *)0x11ab9f;
    pfVar9 = pfStack_a20;
    fVar2 = fdb_iterator_seek((fdb_iterator *)pfStack_a20,auStack_9e8,0xb,'\x01');
    if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011ad08;
    ptr_iterator = &pfStack_a20;
    pfStack_a30 = (fdb_kvs_handle *)0x11abb4;
    fdb_iterator_close((fdb_iterator *)pfStack_a20);
    pfStack_a30 = (fdb_kvs_handle *)0x11abd7;
    fVar2 = fdb_iterator_init(pfStack_9f8,(fdb_iterator **)ptr_iterator,(void *)0x0,0,&uStack_a08,
                              0xb,0);
    pfVar9 = pfStack_9f8;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ad0d;
    pfStack_a30 = (fdb_kvs_handle *)0x11abf8;
    pfVar9 = pfStack_a20;
    fVar2 = fdb_iterator_seek((fdb_iterator *)pfStack_a20,&uStack_a08,0xb,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ad12;
    pfStack_a30 = (fdb_kvs_handle *)0x11ac0f;
    pfVar9 = pfStack_a20;
    fVar2 = fdb_iterator_get((fdb_iterator *)pfStack_a20,(fdb_doc **)&pfStack_a18);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_a30 = (fdb_kvs_handle *)0x11ac21;
      fdb_doc_free((fdb_doc *)pfStack_a18);
      pfStack_a18 = (fdb_kvs_handle *)0x0;
      pfStack_a30 = (fdb_kvs_handle *)0x11ac34;
      fVar2 = fdb_iterator_prev((fdb_iterator *)pfStack_a20);
      if (fVar2 != FDB_RESULT_ITERATOR_FAIL) {
        do {
          pfStack_a30 = (fdb_kvs_handle *)0x11ac4b;
          pfVar9 = pfStack_a20;
          fVar2 = fdb_iterator_get((fdb_iterator *)pfStack_a20,(fdb_doc **)&pfStack_a18);
          if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ace0;
          pfStack_a30 = (fdb_kvs_handle *)0x11ac5d;
          fdb_doc_free((fdb_doc *)pfStack_a18);
          pfStack_a18 = (fdb_kvs_handle *)0x0;
          pfStack_a30 = (fdb_kvs_handle *)0x11ac70;
          fVar2 = fdb_iterator_prev((fdb_iterator *)pfStack_a20);
        } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
      }
      pfStack_a30 = (fdb_kvs_handle *)0x11ac7f;
      fdb_iterator_close((fdb_iterator *)pfStack_a20);
      pfStack_a30 = (fdb_kvs_handle *)0x11ac89;
      fdb_close(pfStack_9f0);
      pfStack_a30 = (fdb_kvs_handle *)0x11ac8e;
      fdb_shutdown();
      pfStack_a30 = (fdb_kvs_handle *)0x11ac93;
      memleak_end();
      pcVar16 = "%s PASSED\n";
      if (iterator_manual_wal_flush()::__test_pass != '\0') {
        pcVar16 = "%s FAILED\n";
      }
      pfStack_a30 = (fdb_kvs_handle *)0x11acc4;
      fprintf(_stderr,pcVar16,"iterator manual wal flush");
      return;
    }
  }
  else {
LAB_0011ace5:
    pfStack_a30 = (fdb_kvs_handle *)0x11acea;
    iterator_manual_wal_flush();
LAB_0011acea:
    pfStack_a30 = (fdb_kvs_handle *)0x11acef;
    iterator_manual_wal_flush();
LAB_0011acef:
    pfStack_a30 = (fdb_kvs_handle *)0x11acf4;
    iterator_manual_wal_flush();
LAB_0011acf4:
    pfStack_a30 = (fdb_kvs_handle *)0x11acf9;
    iterator_manual_wal_flush();
LAB_0011acf9:
    pfStack_a30 = (fdb_kvs_handle *)0x11acfe;
    iterator_manual_wal_flush();
LAB_0011acfe:
    pfStack_a30 = (fdb_kvs_handle *)0x11ad03;
    iterator_manual_wal_flush();
LAB_0011ad03:
    pfStack_a30 = (fdb_kvs_handle *)0x11ad08;
    iterator_manual_wal_flush();
LAB_0011ad08:
    pfStack_a30 = (fdb_kvs_handle *)0x11ad0d;
    iterator_manual_wal_flush();
LAB_0011ad0d:
    pfStack_a30 = (fdb_kvs_handle *)0x11ad12;
    iterator_manual_wal_flush();
LAB_0011ad12:
    pfStack_a30 = (fdb_kvs_handle *)0x11ad17;
    iterator_manual_wal_flush();
  }
  pfStack_a30 = (fdb_kvs_handle *)sequence_iterator_seek_test;
  iterator_manual_wal_flush();
  ptr_iterator_00 = (fdb_config **)((ulong)pfVar9 & 0xffffffff);
  pfStack_ef8 = (fdb_kvs_handle *)0x11ad41;
  ppfStack_a58 = ptr_iterator;
  pbStack_a50 = ptr_fhandle_00;
  ppfStack_a48 = ppfVar13;
  puStack_a40 = &uStack_9c8;
  puStack_a38 = &uStack_9d8;
  pfStack_a30 = pfVar19;
  gettimeofday(&tStack_e60,(__timezone_ptr_t)0x0);
  pfStack_ef8 = (fdb_kvs_handle *)0x11ad46;
  memleak_start();
  pfStack_ee0 = (fdb_config *)0x0;
  pfStack_ef8 = (fdb_kvs_handle *)0x11ad57;
  system("rm -rf  iterator_test* > errorlog.txt");
  pfVar14 = &fStack_b50;
  pfStack_ef8 = (fdb_kvs_handle *)0x11ad67;
  fdb_get_default_config();
  pfStack_ef8 = (fdb_kvs_handle *)0x11ad71;
  fdb_get_default_kvs_config();
  fStack_b50.buffercache_size = 0;
  fStack_b50.wal_threshold = 0x400;
  fStack_b50.seqtree_opt = '\x01';
  fStack_b50.flags = 1;
  fStack_b50.multi_kv_instances = SUB81(ptr_iterator_00,0);
  fStack_b50.compaction_threshold = '\0';
  ptr_fhandle = &pfStack_ed0;
  pfStack_ef8 = (fdb_kvs_handle *)0x11adaa;
  fdb_open(ptr_fhandle,"./iterator_test7",pfVar14);
  if ((int)pfVar9 == 0) {
    pfStack_ef8 = (fdb_kvs_handle *)0x11add8;
    fdb_kvs_open_default(pfStack_ed0,&pfStack_ed8,&fStack_ec8);
  }
  else {
    pfStack_ef8 = (fdb_kvs_handle *)0x11adc7;
    fdb_kvs_open(pfStack_ed0,&pfStack_ed8,"kv1",&fStack_ec8);
  }
  pfStack_ef8 = (fdb_kvs_handle *)0x11adf0;
  fVar2 = fdb_set_log_callback(pfStack_ed8,logCallbackFunc,"sequence_iterator_seek_test");
  if (fVar2 == FDB_RESULT_SUCCESS) {
    lVar12 = 0;
    uVar11 = 0;
    do {
      pfVar1 = &fStack_e50.config.encryption_key;
      pfStack_ef8 = (fdb_kvs_handle *)0x11ae18;
      sprintf((char *)pfVar1,"key%d",uVar11 & 0xffffffff);
      pfStack_ef8 = (fdb_kvs_handle *)0x11ae30;
      sprintf((char *)&fStack_e50.bub_ctx.handle,"meta%d",uVar11 & 0xffffffff);
      pfStack_ef8 = (fdb_kvs_handle *)0x11ae48;
      sprintf((char *)&fStack_e50,"body%d",uVar11 & 0xffffffff);
      pfStack_ef8 = (fdb_kvs_handle *)0x11ae58;
      sVar5 = strlen((char *)pfVar1);
      ppfVar13 = &fStack_e50.bub_ctx.handle;
      pfStack_ef8 = (fdb_kvs_handle *)0x11ae6b;
      sVar7 = strlen((char *)ppfVar13);
      pfStack_ef8 = (fdb_kvs_handle *)0x11ae7b;
      sVar8 = strlen((char *)&fStack_e50);
      pfStack_ef8 = (fdb_kvs_handle *)0x11aea0;
      fdb_doc_create((fdb_doc **)((long)apfStack_eb0 + lVar12),&fStack_e50.config.encryption_key,
                     sVar5,ppfVar13,sVar7,&fStack_e50,sVar8);
      pfStack_ef8 = (fdb_kvs_handle *)0x11aeaf;
      fdb_set(pfStack_ed8,apfStack_eb0[uVar11]);
      uVar11 = uVar11 + 1;
      lVar12 = lVar12 + 8;
    } while (uVar11 != 5);
    pfStack_ef8 = (fdb_kvs_handle *)0x11aecf;
    fdb_commit(pfStack_ed0,'\x01');
    uVar11 = 5;
    pfVar14 = (fdb_config *)apfStack_e88;
    do {
      pfVar1 = &fStack_e50.config.encryption_key;
      pfStack_ef8 = (fdb_kvs_handle *)0x11aef4;
      sprintf((char *)pfVar1,"key%d",uVar11 & 0xffffffff);
      ppfVar13 = &fStack_e50.bub_ctx.handle;
      pfStack_ef8 = (fdb_kvs_handle *)0x11af0f;
      sprintf((char *)ppfVar13,"meta%d",uVar11 & 0xffffffff);
      pfVar19 = &fStack_e50;
      pfStack_ef8 = (fdb_kvs_handle *)0x11af2a;
      sprintf((char *)pfVar19,"body%d",uVar11 & 0xffffffff);
      pfStack_ef8 = (fdb_kvs_handle *)0x11af32;
      ptr_fhandle = (fdb_file_handle **)strlen((char *)pfVar1);
      pfStack_ef8 = (fdb_kvs_handle *)0x11af3d;
      ptr_fhandle_00 = (btree *)strlen((char *)ppfVar13);
      pfStack_ef8 = (fdb_kvs_handle *)0x11af48;
      sVar5 = strlen((char *)pfVar19);
      pfStack_ef8 = (fdb_kvs_handle *)0x11af68;
      fdb_doc_create((fdb_doc **)pfVar14,&fStack_e50.config.encryption_key,(size_t)ptr_fhandle,
                     ppfVar13,(size_t)ptr_fhandle_00,pfVar19,sVar5);
      pfStack_ef8 = (fdb_kvs_handle *)0x11af75;
      fdb_set(pfStack_ed8,(fdb_doc *)*(fdb_kvs_handle **)pfVar14);
      uVar11 = uVar11 + 1;
      pfVar14 = (fdb_config *)((long)pfVar14 + 8);
    } while (uVar11 != 10);
    pfStack_ef8 = (fdb_kvs_handle *)0x11af92;
    fdb_commit(pfStack_ed0,'\0');
    ptr_iterator_00 = &pfStack_ee8;
    pfStack_ef8 = (fdb_kvs_handle *)0x11afab;
    fdb_iterator_sequence_init(pfStack_ed8,(fdb_iterator **)ptr_iterator_00,0,0,0);
    pfStack_ef8 = (fdb_kvs_handle *)0x11afb3;
    fVar2 = fdb_iterator_seek_to_max((fdb_iterator *)pfStack_ee8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b324;
    ppfVar13 = apfStack_e88 + 4;
    pfVar21 = pfVar14;
    do {
      pfStack_ef8 = (fdb_kvs_handle *)0x11afd5;
      fVar2 = fdb_iterator_get((fdb_iterator *)pfStack_ee8,(fdb_doc **)&pfStack_ee0);
      pfVar14 = pfStack_ee0;
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011b2b8:
        pfStack_ef8 = (fdb_kvs_handle *)0x11b2bd;
        sequence_iterator_seek_test();
        pfVar14 = pfVar21;
LAB_0011b2bd:
        pfStack_ef8 = (fdb_kvs_handle *)0x11b2c8;
        sequence_iterator_seek_test();
LAB_0011b2c8:
        pfStack_ef8 = (fdb_kvs_handle *)0x11b2d3;
        sequence_iterator_seek_test();
        goto LAB_0011b2d3;
      }
      sVar5._0_2_ = pfStack_ee0->chunksize;
      sVar5._2_2_ = *(undefined2 *)&pfStack_ee0->field_0x2;
      sVar5._4_4_ = pfStack_ee0->blocksize;
      ptr_fhandle = *(fdb_file_handle ***)&pfStack_ee0->seqtree_opt;
      pfVar19 = *ppfVar13;
      ptr_fhandle_00 = (btree *)pfVar19->op_stats;
      pfStack_ef8 = (fdb_kvs_handle *)0x11affc;
      iVar3 = bcmp(ptr_fhandle,ptr_fhandle_00,sVar5);
      pfVar21 = pfVar14;
      if (iVar3 != 0) {
        pfStack_ef8 = (fdb_kvs_handle *)0x11b2b8;
        sequence_iterator_seek_test();
        goto LAB_0011b2b8;
      }
      ptr_fhandle = (fdb_file_handle **)pfVar14->compactor_sleep_duration;
      ptr_fhandle_00 = pfVar19->staletree;
      pfStack_ef8 = (fdb_kvs_handle *)0x11b01b;
      iVar3 = bcmp(ptr_fhandle,ptr_fhandle_00,pfVar14->buffercache_size);
      if (iVar3 != 0) goto LAB_0011b2c8;
      ptr_fhandle = *(fdb_file_handle ***)&pfVar14->multi_kv_instances;
      ptr_fhandle_00 = (pfVar19->field_6).seqtree;
      pfStack_ef8 = (fdb_kvs_handle *)0x11b03a;
      iVar3 = bcmp(ptr_fhandle,ptr_fhandle_00,pfVar14->wal_threshold);
      if (iVar3 != 0) goto LAB_0011b2bd;
      pfStack_ef8 = (fdb_kvs_handle *)0x11b04a;
      fdb_doc_free((fdb_doc *)pfVar14);
      pfStack_ee0 = (fdb_config *)0x0;
      pfStack_ef8 = (fdb_kvs_handle *)0x11b05d;
      fVar2 = fdb_iterator_prev((fdb_iterator *)pfStack_ee8);
      ppfVar13 = ppfVar13 + -1;
    } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
    ptr_iterator_00 = &pfStack_ee8;
    pfStack_ef8 = (fdb_kvs_handle *)0x11b077;
    fdb_iterator_close((fdb_iterator *)pfStack_ee8);
    pfStack_ef8 = (fdb_kvs_handle *)0x11b08e;
    fdb_iterator_sequence_init(pfStack_ed8,(fdb_iterator **)ptr_iterator_00,0,7,0);
    pfStack_ef8 = (fdb_kvs_handle *)0x11b096;
    fVar2 = fdb_iterator_seek_to_max((fdb_iterator *)pfStack_ee8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b329;
    ppfVar13 = apfStack_e88 + 1;
    do {
      pfStack_ef8 = (fdb_kvs_handle *)0x11b0b5;
      fVar2 = fdb_iterator_get((fdb_iterator *)pfStack_ee8,(fdb_doc **)&pfStack_ee0);
      pfVar14 = pfStack_ee0;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b2de;
      sVar7._0_2_ = pfStack_ee0->chunksize;
      sVar7._2_2_ = *(undefined2 *)&pfStack_ee0->field_0x2;
      sVar7._4_4_ = pfStack_ee0->blocksize;
      ptr_fhandle = *(fdb_file_handle ***)&pfStack_ee0->seqtree_opt;
      pfVar19 = *ppfVar13;
      ptr_fhandle_00 = (btree *)pfVar19->op_stats;
      pfStack_ef8 = (fdb_kvs_handle *)0x11b0dc;
      iVar3 = bcmp(ptr_fhandle,ptr_fhandle_00,sVar7);
      if (iVar3 != 0) goto LAB_0011b2d3;
      ptr_fhandle = (fdb_file_handle **)pfVar14->compactor_sleep_duration;
      ptr_fhandle_00 = pfVar19->staletree;
      pfStack_ef8 = (fdb_kvs_handle *)0x11b0fb;
      iVar3 = bcmp(ptr_fhandle,ptr_fhandle_00,pfVar14->buffercache_size);
      if (iVar3 != 0) goto LAB_0011b2ee;
      ptr_fhandle = *(fdb_file_handle ***)&pfVar14->multi_kv_instances;
      ptr_fhandle_00 = (pfVar19->field_6).seqtree;
      pfStack_ef8 = (fdb_kvs_handle *)0x11b11a;
      iVar3 = bcmp(ptr_fhandle,ptr_fhandle_00,pfVar14->wal_threshold);
      if (iVar3 != 0) goto LAB_0011b2e3;
      pfStack_ef8 = (fdb_kvs_handle *)0x11b12a;
      fdb_doc_free((fdb_doc *)pfVar14);
      pfStack_ee0 = (fdb_config *)0x0;
      pfStack_ef8 = (fdb_kvs_handle *)0x11b13d;
      fVar2 = fdb_iterator_prev((fdb_iterator *)pfStack_ee8);
      ppfVar13 = ppfVar13 + -1;
      pfVar21 = pfVar14;
    } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
    ptr_iterator_00 = &pfStack_ee8;
    pfStack_ef8 = (fdb_kvs_handle *)0x11b157;
    fdb_iterator_close((fdb_iterator *)pfStack_ee8);
    pfStack_ef8 = (fdb_kvs_handle *)0x11b171;
    fdb_iterator_sequence_init(pfStack_ed8,(fdb_iterator **)ptr_iterator_00,0,7,8);
    pfStack_ef8 = (fdb_kvs_handle *)0x11b179;
    fVar2 = fdb_iterator_seek_to_max((fdb_iterator *)pfStack_ee8);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      ppfVar13 = apfStack_e88;
      while( true ) {
        pfStack_ef8 = (fdb_kvs_handle *)0x11b198;
        fVar2 = fdb_iterator_get((fdb_iterator *)pfStack_ee8,(fdb_doc **)&pfStack_ee0);
        pfVar14 = pfStack_ee0;
        if (fVar2 != FDB_RESULT_SUCCESS) break;
        sVar8._0_2_ = pfStack_ee0->chunksize;
        sVar8._2_2_ = *(undefined2 *)&pfStack_ee0->field_0x2;
        sVar8._4_4_ = pfStack_ee0->blocksize;
        ptr_fhandle = *(fdb_file_handle ***)&pfStack_ee0->seqtree_opt;
        pfVar19 = *ppfVar13;
        ptr_fhandle_00 = (btree *)pfVar19->op_stats;
        pfStack_ef8 = (fdb_kvs_handle *)0x11b1bf;
        iVar3 = bcmp(ptr_fhandle,ptr_fhandle_00,sVar8);
        if (iVar3 != 0) goto LAB_0011b2f9;
        ptr_fhandle = (fdb_file_handle **)pfVar14->compactor_sleep_duration;
        ptr_fhandle_00 = pfVar19->staletree;
        pfStack_ef8 = (fdb_kvs_handle *)0x11b1de;
        iVar3 = bcmp(ptr_fhandle,ptr_fhandle_00,pfVar14->buffercache_size);
        if (iVar3 != 0) goto LAB_0011b314;
        ptr_fhandle = *(fdb_file_handle ***)&pfVar14->multi_kv_instances;
        ptr_fhandle_00 = (pfVar19->field_6).seqtree;
        pfStack_ef8 = (fdb_kvs_handle *)0x11b1fd;
        iVar3 = bcmp(ptr_fhandle,ptr_fhandle_00,pfVar14->wal_threshold);
        if (iVar3 != 0) goto LAB_0011b309;
        pfStack_ef8 = (fdb_kvs_handle *)0x11b20d;
        fdb_doc_free((fdb_doc *)pfVar14);
        pfStack_ee0 = (fdb_config *)0x0;
        pfStack_ef8 = (fdb_kvs_handle *)0x11b220;
        fVar2 = fdb_iterator_prev((fdb_iterator *)pfStack_ee8);
        ppfVar13 = ppfVar13 + -1;
        pfVar21 = pfVar14;
        if (fVar2 == FDB_RESULT_ITERATOR_FAIL) {
          pfStack_ef8 = (fdb_kvs_handle *)0x11b237;
          fdb_iterator_close((fdb_iterator *)pfStack_ee8);
          pfStack_ef8 = (fdb_kvs_handle *)0x11b241;
          fdb_kvs_close(pfStack_ed8);
          pfStack_ef8 = (fdb_kvs_handle *)0x11b24b;
          fdb_close(pfStack_ed0);
          lVar12 = 0;
          do {
            pfStack_ef8 = (fdb_kvs_handle *)0x11b257;
            fdb_doc_free(apfStack_eb0[lVar12]);
            lVar12 = lVar12 + 1;
          } while (lVar12 != 10);
          pfStack_ef8 = (fdb_kvs_handle *)0x11b265;
          fdb_shutdown();
          pfStack_ef8 = (fdb_kvs_handle *)0x11b26a;
          memleak_end();
          pcVar16 = "%s PASSED\n";
          if (sequence_iterator_seek_test(bool)::__test_pass != '\0') {
            pcVar16 = "%s FAILED\n";
          }
          pfStack_ef8 = (fdb_kvs_handle *)0x11b29b;
          fprintf(_stderr,pcVar16,"sequence iterator seek test");
          return;
        }
      }
LAB_0011b304:
      pfVar14 = pfVar21;
      pfStack_ef8 = (fdb_kvs_handle *)0x11b309;
      sequence_iterator_seek_test();
LAB_0011b309:
      pfStack_ef8 = (fdb_kvs_handle *)0x11b314;
      sequence_iterator_seek_test();
LAB_0011b314:
      ptr_iterator_00 = &pfStack_ee0;
      pfStack_ef8 = (fdb_kvs_handle *)0x11b31f;
      sequence_iterator_seek_test();
      goto LAB_0011b31f;
    }
  }
  else {
LAB_0011b31f:
    pfStack_ef8 = (fdb_kvs_handle *)0x11b324;
    sequence_iterator_seek_test();
LAB_0011b324:
    pfStack_ef8 = (fdb_kvs_handle *)0x11b329;
    sequence_iterator_seek_test();
LAB_0011b329:
    pfStack_ef8 = (fdb_kvs_handle *)0x11b32e;
    sequence_iterator_seek_test();
  }
  pfStack_ef8 = (fdb_kvs_handle *)iterator_concurrent_compaction;
  sequence_iterator_seek_test();
  ppfStack_12a0 = (fdb_doc **)0x11b350;
  ppfStack_f20 = ptr_iterator_00;
  pbStack_f18 = ptr_fhandle_00;
  ppfStack_f10 = ppfVar13;
  pfStack_f08 = pfVar14;
  ppfStack_f00 = ptr_fhandle;
  pfStack_ef8 = pfVar19;
  gettimeofday((timeval *)(auStack_1258 + 0x28),(__timezone_ptr_t)0x0);
  ppfStack_12a0 = (fdb_doc **)0x11b355;
  memleak_start();
  pfStack_1290 = (fdb_kvs_handle *)0x0;
  ppfStack_12a0 = (fdb_doc **)0x11b36b;
  fdb_get_default_config();
  ppfStack_12a0 = (fdb_doc **)0x11b378;
  fdb_get_default_kvs_config();
  fStack_1220.wal_threshold = 0x400;
  fStack_1220.seqtree_opt = '\x01';
  fStack_1220.flags = 1;
  ppfStack_12a0 = (fdb_doc **)0x11b397;
  system("rm -rf  iterator_test* > errorlog.txt");
  ppfStack_12a0 = (fdb_doc **)0x11b3ae;
  fdb_open(&pfStack_1270,"./iterator_test1",&fStack_1220);
  ppfStack_12a0 = (fdb_doc **)0x11b3c5;
  fdb_kvs_open(pfStack_1270,&pfStack_1278,"db",(fdb_kvs_config *)(auStack_1258 + 0x10));
  pcVar16 = "body%d";
  pfVar19 = (fdb_kvs_handle *)(apfStack_1128 + 0x20);
  doc = (fdb_doc **)0x0;
  do {
    ppfStack_12a0 = (fdb_doc **)0x11b3f1;
    sprintf((char *)apfStack_1128,"key%d",doc);
    ppfStack_12a0 = (fdb_doc **)0x11b400;
    sprintf((char *)pfVar19,"body%d",doc);
    pfVar9 = pfStack_1278;
    ppfStack_12a0 = (fdb_doc **)0x11b40d;
    sVar5 = strlen((char *)apfStack_1128);
    ppfStack_12a0 = (fdb_doc **)0x11b418;
    sVar7 = strlen((char *)pfVar19);
    ppfStack_12a0 = (fdb_doc **)0x11b42c;
    fdb_set_kv(pfVar9,apfStack_1128,sVar5,pfVar19,sVar7);
    uVar15 = (int)doc + 1;
    doc = (fdb_doc **)(ulong)uVar15;
  } while (uVar15 != 10);
  ppfStack_12a0 = (fdb_doc **)0x11b43f;
  fdb_commit(pfStack_1270,'\0');
  ppfStack_12a0 = (fdb_doc **)0x11b458;
  fdb_open(&pfStack_1260,"./iterator_test1",&fStack_1220);
  ppfVar13 = (fdb_kvs_handle **)(auStack_1258 + 8);
  ppfStack_12a0 = (fdb_doc **)0x11b474;
  fdb_kvs_open(pfStack_1260,ppfVar13,"db",(fdb_kvs_config *)(auStack_1258 + 0x10));
  ppfStack_12a0 = (fdb_doc **)0x11b485;
  fdb_compact(pfStack_1270,"./iterator_test2");
  ppfStack_12a0 = (fdb_doc **)0x11b4a3;
  fVar2 = fdb_iterator_init((fdb_kvs_handle *)auStack_1258._8_8_,&pfStack_1280,(void *)0x0,0,
                            (void *)0x0,0,0);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    ppfStack_12a0 = (fdb_doc **)0x11b4c1;
    fVar2 = fdb_iterator_sequence_init(pfStack_1278,&pfStack_1288,0,0,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b62d;
    pcVar16 = (char *)&pfStack_1268;
    pfVar19 = (fdb_kvs_handle *)auStack_1258;
    doc = (fdb_doc **)0x0;
    do {
      ppfStack_12a0 = (fdb_doc **)0x11b4f3;
      sprintf((char *)apfStack_1128,"key%d",doc);
      pfVar9 = pfStack_1278;
      ppfStack_12a0 = (fdb_doc **)0x11b500;
      sVar5 = strlen((char *)apfStack_1128);
      ppfStack_12a0 = (fdb_doc **)0x11b514;
      fdb_get_kv(pfVar9,apfStack_1128,sVar5,(void **)pcVar16,(size_t *)pfVar19);
      ppfStack_12a0 = (fdb_doc **)0x11b51e;
      fdb_free_block(pfStack_1268);
      uVar15 = (int)doc + 1;
      doc = (fdb_doc **)(ulong)uVar15;
    } while (uVar15 != 10);
    ppfVar13 = &pfStack_1290;
    do {
      pfStack_1290 = (fdb_kvs_handle *)0x0;
      ppfStack_12a0 = (fdb_doc **)0x11b540;
      fVar2 = fdb_iterator_get(pfStack_1280,(fdb_doc **)ppfVar13);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        ppfStack_12a0 = (fdb_doc **)0x11b623;
        iterator_concurrent_compaction();
        goto LAB_0011b623;
      }
      ppfStack_12a0 = (fdb_doc **)0x11b552;
      fdb_doc_free((fdb_doc *)pfStack_1290);
      ppfStack_12a0 = (fdb_doc **)0x11b55c;
      fVar2 = fdb_iterator_next(pfStack_1280);
    } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
    ppfStack_12a0 = (fdb_doc **)0x11b56b;
    fVar2 = fdb_iterator_close(pfStack_1280);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b632;
    ppfVar13 = &pfStack_1290;
    do {
      pfStack_1290 = (fdb_kvs_handle *)0x0;
      ppfStack_12a0 = (fdb_doc **)0x11b58e;
      fVar2 = fdb_iterator_get(pfStack_1288,(fdb_doc **)ppfVar13);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b623;
      ppfStack_12a0 = (fdb_doc **)0x11b5a0;
      fdb_doc_free((fdb_doc *)pfStack_1290);
      ppfStack_12a0 = (fdb_doc **)0x11b5aa;
      fVar2 = fdb_iterator_next(pfStack_1288);
    } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
    ppfStack_12a0 = (fdb_doc **)0x11b5b9;
    fVar2 = fdb_iterator_close(pfStack_1288);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      ppfStack_12a0 = (fdb_doc **)0x11b5c7;
      fdb_close(pfStack_1270);
      ppfStack_12a0 = (fdb_doc **)0x11b5d1;
      fdb_close(pfStack_1260);
      ppfStack_12a0 = (fdb_doc **)0x11b5d6;
      fdb_shutdown();
      ppfStack_12a0 = (fdb_doc **)0x11b5db;
      memleak_end();
      pcVar16 = "%s PASSED\n";
      if (iterator_concurrent_compaction()::__test_pass != '\0') {
        pcVar16 = "%s FAILED\n";
      }
      ppfStack_12a0 = (fdb_doc **)0x11b60c;
      fprintf(_stderr,pcVar16,"iterator with concurrent compaction test");
      return;
    }
  }
  else {
LAB_0011b628:
    ppfStack_12a0 = (fdb_doc **)0x11b62d;
    iterator_concurrent_compaction();
LAB_0011b62d:
    ppfStack_12a0 = (fdb_doc **)0x11b632;
    iterator_concurrent_compaction();
LAB_0011b632:
    ppfStack_12a0 = (fdb_doc **)0x11b637;
    iterator_concurrent_compaction();
  }
  doc_01 = (char *)apfStack_1128;
  ppfStack_12a0 = (fdb_doc **)iterator_offset_access_test;
  iterator_concurrent_compaction();
  ppfStack_3578 = (fdb_doc **)0x11b659;
  ppfStack_12c8 = ppfVar13;
  pfStack_12c0 = pfVar19;
  ppfStack_12b0 = (fdb_doc **)doc_01;
  ppfStack_12a8 = (fdb_doc **)pcVar16;
  ppfStack_12a0 = doc;
  gettimeofday(&tStack_3520,(__timezone_ptr_t)0x0);
  ppfStack_3578 = (fdb_doc **)0x11b65e;
  memleak_start();
  pfStack_3550 = (fdb_doc *)0x0;
  ppfStack_3578 = (fdb_doc **)0x11b673;
  system("rm -rf  iterator_test* > errorlog.txt");
  pfVar9 = (fdb_kvs_handle *)(auStack_3410 + 0x108);
  ppfStack_3578 = (fdb_doc **)0x11b683;
  fdb_get_default_config();
  ppfStack_3578 = (fdb_doc **)0x11b68d;
  fdb_get_default_kvs_config();
  auStack_3300[8] = '\0';
  auStack_3300[9] = '\x02';
  auStack_3300[10] = '\0';
  auStack_3300[0xb] = '\0';
  auStack_3300[0xc] = '\0';
  auStack_3300[0xd] = '\0';
  auStack_3300[0xe] = '\0';
  auStack_3300[0xf] = '\0';
  auStack_3300[0] = '\0';
  auStack_3300[1] = '\x10';
  auStack_3300[2] = '\0';
  auStack_3300[3] = '\0';
  auStack_3300[4] = '\0';
  auStack_3300[5] = '\0';
  auStack_3300[6] = '\0';
  auStack_3300[7] = '\0';
  uStack_32e4 = 1;
  uStack_32da = 0;
  uStack_32ec = 1;
  ppfStack_3578 = (fdb_doc **)0x11b6c0;
  fVar2 = fdb_open(&pfStack_3560,"./iterator_test1",(fdb_config *)pfVar9);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    ppfStack_3578 = (fdb_doc **)0x11b6e3;
    fVar2 = fdb_kvs_open(pfStack_3560,&pfStack_3568,"DB",&fStack_3538);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb7e;
    ppfStack_3578 = (fdb_doc **)0x11b706;
    fVar2 = fdb_kvs_open(pfStack_3560,&pfStack_3548,"ODB",&fStack_3538);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb83;
    doc_01 = (char *)apfStack_3510;
    pfVar19 = (fdb_kvs_handle *)auStack_3410;
    pcVar16 = (char *)0x0;
    uVar11 = 0;
    do {
      ppfStack_3578 = (fdb_doc **)0x11b735;
      sprintf(doc_01,"key%d",uVar11 & 0xffffffff);
      ppfStack_3578 = (fdb_doc **)0x11b749;
      sprintf((char *)pfVar19,"body%d",uVar11 & 0xffffffff);
      doc = (fdb_doc **)((long)apfStack_3210 + (long)pcVar16);
      ppfStack_3578 = (fdb_doc **)0x11b75c;
      pfVar9 = (fdb_kvs_handle *)strlen(doc_01);
      ppfStack_3578 = (fdb_doc **)0x11b767;
      sVar5 = strlen((char *)pfVar19);
      ppfStack_3578 = (fdb_doc **)0x11b781;
      fdb_doc_create(doc,doc_01,(size_t)pfVar9,(void *)0x0,0,pfVar19,sVar5);
      ppfStack_3578 = (fdb_doc **)0x11b793;
      fVar2 = fdb_set(pfStack_3568,apfStack_3210[uVar11]);
      pfVar4 = pfStack_3548;
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011bb4c:
        ppfStack_3578 = (fdb_doc **)0x11bb51;
        iterator_offset_access_test();
        goto LAB_0011bb51;
      }
      ppfStack_3578 = (fdb_doc **)0x11b7a8;
      sVar5 = strlen(doc_01);
      ppfStack_3578 = (fdb_doc **)0x11b7c8;
      fVar2 = fdb_set_kv(pfVar4,doc_01,sVar5,&apfStack_3210[uVar11]->offset,8);
      pfVar9 = pfVar4;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        ppfStack_3578 = (fdb_doc **)0x11bb4c;
        iterator_offset_access_test();
        goto LAB_0011bb4c;
      }
      uVar11 = uVar11 + 1;
      pcVar16 = (char *)((long)pcVar16 + 8);
    } while (uVar11 != 1000);
    ppfStack_3578 = (fdb_doc **)0x11b7f3;
    fVar2 = fdb_commit(pfStack_3560,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb88;
    pfVar9 = (fdb_kvs_handle *)0xfa;
    doc_01 = "key%d";
    pcVar16 = (char *)apfStack_3510;
    do {
      ppfStack_3578 = (fdb_doc **)0x11b81b;
      sprintf(pcVar16,"key%d",pfVar9);
      pfVar19 = pfStack_3568;
      ppfStack_3578 = (fdb_doc **)0x11b828;
      sVar5 = strlen(pcVar16);
      ppfStack_3578 = (fdb_doc **)0x11b836;
      fVar2 = fdb_del_kv(pfVar19,pcVar16,sVar5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb51;
      uVar15 = (int)pfVar9 + 1;
      pfVar9 = (fdb_kvs_handle *)(ulong)uVar15;
    } while (uVar15 != 500);
    doc_01 = (char *)apfStack_3510;
    pfVar19 = (fdb_kvs_handle *)auStack_3410;
    pcVar16 = (char *)0x0;
    uVar11 = 0;
    do {
      ppfStack_3578 = (fdb_doc **)0x11b86f;
      sprintf(doc_01,"k0y%d",uVar11 & 0xffffffff);
      ppfStack_3578 = (fdb_doc **)0x11b883;
      sprintf((char *)pfVar19,"b0dy%d",uVar11 & 0xffffffff);
      doc = (fdb_doc **)((long)apfStack_3210 + (long)pcVar16);
      ppfStack_3578 = (fdb_doc **)0x11b89b;
      fdb_doc_free(apfStack_3210[uVar11]);
      ppfStack_3578 = (fdb_doc **)0x11b8a3;
      pfVar9 = (fdb_kvs_handle *)strlen(doc_01);
      ppfStack_3578 = (fdb_doc **)0x11b8ae;
      sVar5 = strlen((char *)pfVar19);
      ppfStack_3578 = (fdb_doc **)0x11b8c8;
      fdb_doc_create(doc,doc_01,(size_t)pfVar9,(void *)0x0,0,pfVar19,sVar5);
      ppfStack_3578 = (fdb_doc **)0x11b8da;
      fVar2 = fdb_set(pfStack_3568,apfStack_3210[uVar11]);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb56;
      uVar11 = uVar11 + 1;
      pcVar16 = (char *)((long)pcVar16 + 8);
    } while (uVar11 != 0xfa);
    ppfStack_3578 = (fdb_doc **)0x11b902;
    fVar2 = fdb_commit(pfStack_3560,'\0');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb8d;
    ppfStack_3578 = (fdb_doc **)0x11b92a;
    fdb_iterator_init(pfStack_3548,&pfStack_3558,(void *)0x0,0,(void *)0x0,0,2);
    pfVar19 = (fdb_kvs_handle *)0x1ea;
    pfVar9 = afStack_2270;
    doc_01 = (char *)&pfStack_3550;
    pcVar16 = (char *)&pfStack_3540;
    do {
      ppfStack_3578 = (fdb_doc **)0x11b94f;
      fVar2 = fdb_get_byoffset(pfStack_3568,*(fdb_doc **)&pfVar9->kvs_config);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb60;
      ppfStack_3578 = (fdb_doc **)0x11b96d;
      fVar2 = fdb_iterator_seek(pfStack_3558,(void *)(*(size_t **)&pfVar9->kvs_config)[4],
                                **(size_t **)&pfVar9->kvs_config,'\0');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb5b;
      ppfStack_3578 = (fdb_doc **)0x11b982;
      fVar2 = fdb_iterator_get(pfStack_3558,(fdb_doc **)doc_01);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb6a;
      doc_00 = *(fdb_doc **)&pfVar9->kvs_config;
      if (*pfStack_3550->body != (*(fdb_doc **)&pfVar9->kvs_config)->offset) {
        ppfStack_3578 = (fdb_doc **)0x11b9e3;
        iterator_offset_access_test();
        doc_00 = pfStack_3540;
      }
      ppfStack_3578 = (fdb_doc **)0x11b9a9;
      fVar2 = fdb_del(pfStack_3568,doc_00);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb65;
      ppfStack_3578 = (fdb_doc **)0x11b9be;
      fdb_get_metaonly(pfStack_3568,*(fdb_doc **)&pfVar9->kvs_config);
      pfVar19 = (fdb_kvs_handle *)((long)&(pfVar19->kvs_config).custom_cmp + 2);
      pfVar9 = (fdb_kvs_handle *)&pfVar9->dhandle;
    } while (pfVar19 < (fdb_kvs_handle *)0x3de);
    ppfStack_3578 = (fdb_doc **)0x11b9f4;
    fdb_iterator_close(pfStack_3558);
    ppfStack_3578 = (fdb_doc **)0x11ba03;
    fVar2 = fdb_commit(pfStack_3560,'\x01');
    if (fVar2 == FDB_RESULT_SUCCESS) {
      doc_01 = (char *)apfStack_3510;
      pcVar16 = "b1dy%d";
      pfVar19 = (fdb_kvs_handle *)auStack_3410;
      doc = (fdb_doc **)0x0;
      do {
        ppfStack_3578 = (fdb_doc **)0x11ba34;
        sprintf(doc_01,"k1y%d",doc);
        ppfStack_3578 = (fdb_doc **)0x11ba43;
        sprintf((char *)pfVar19,"b1dy%d",doc);
        pfVar4 = pfStack_3568;
        ppfStack_3578 = (fdb_doc **)0x11ba50;
        pfVar9 = (fdb_kvs_handle *)strlen(doc_01);
        ppfStack_3578 = (fdb_doc **)0x11ba5b;
        sVar5 = strlen((char *)pfVar19);
        ppfStack_3578 = (fdb_doc **)0x11ba6f;
        fVar2 = fdb_set_kv(pfVar4,doc_01,(size_t)pfVar9,pfVar19,sVar5);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb6f;
        uVar15 = (int)doc + 1;
        doc = (fdb_doc **)(ulong)uVar15;
      } while (uVar15 != 0xfa);
      doc_01 = (char *)0x1ea;
      pfVar9 = afStack_2270;
      while( true ) {
        ppfStack_3578 = (fdb_doc **)0x11ba9c;
        fVar2 = fdb_get_byoffset(pfStack_3568,*(fdb_doc **)&pfVar9->kvs_config);
        if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) break;
        if (*(char *)(*(long *)&pfVar9->kvs_config + 0x48) == '\0') {
          ppfStack_3578 = (fdb_doc **)0x11bac9;
          iterator_offset_access_test();
        }
        doc_01 = (char *)((long)doc_01 + 10);
        pfVar9 = (fdb_kvs_handle *)&pfVar9->dhandle;
        if ((fdb_doc **)0x3dd < doc_01) {
          lVar12 = 0;
          do {
            ppfStack_3578 = (fdb_doc **)0x11bada;
            fdb_doc_free(apfStack_3210[lVar12]);
            lVar12 = lVar12 + 1;
          } while (lVar12 != 1000);
          ppfStack_3578 = (fdb_doc **)0x11baf0;
          fdb_doc_free(pfStack_3550);
          ppfStack_3578 = (fdb_doc **)0x11bafa;
          fdb_close(pfStack_3560);
          ppfStack_3578 = (fdb_doc **)0x11baff;
          fdb_shutdown();
          ppfStack_3578 = (fdb_doc **)0x11bb04;
          memleak_end();
          pcVar16 = "%s PASSED\n";
          if (iterator_offset_access_test()::__test_pass != '\0') {
            pcVar16 = "%s FAILED\n";
          }
          ppfStack_3578 = (fdb_doc **)0x11bb35;
          fprintf(_stderr,pcVar16,"iterator offset access test");
          return;
        }
      }
LAB_0011bb74:
      ppfStack_3578 = (fdb_doc **)0x11bb79;
      iterator_offset_access_test();
      goto LAB_0011bb79;
    }
  }
  else {
LAB_0011bb79:
    ppfStack_3578 = (fdb_doc **)0x11bb7e;
    iterator_offset_access_test();
LAB_0011bb7e:
    ppfStack_3578 = (fdb_doc **)0x11bb83;
    iterator_offset_access_test();
LAB_0011bb83:
    ppfStack_3578 = (fdb_doc **)0x11bb88;
    iterator_offset_access_test();
LAB_0011bb88:
    ppfStack_3578 = (fdb_doc **)0x11bb8d;
    iterator_offset_access_test();
LAB_0011bb8d:
    ppfStack_3578 = (fdb_doc **)0x11bb92;
    iterator_offset_access_test();
  }
  ppfStack_3578 = (fdb_doc **)iterator_deleted_doc_right_before_the_end_test;
  iterator_offset_access_test();
  ppfStack_3a00 = (fdb_iterator **)0x11bbb2;
  pfStack_3598 = pfVar9;
  pfStack_3590 = pfVar19;
  ppfStack_3588 = (fdb_doc **)doc_01;
  ppfStack_3580 = (fdb_doc **)pcVar16;
  ppfStack_3578 = doc;
  gettimeofday(&tStack_39c8,(__timezone_ptr_t)0x0);
  ppfStack_3a00 = (fdb_iterator **)0x11bbb7;
  memleak_start();
  ppfStack_3a00 = (fdb_iterator **)0x11bbc7;
  fdb_get_default_config();
  fStack_3790.buffercache_size = 0;
  ppfStack_3a00 = (fdb_iterator **)0x11bbdf;
  fdb_get_default_kvs_config();
  ppfStack_3a00 = (fdb_iterator **)0x11bc02;
  sprintf(acStack_3898,"rm -rf  %s*","./dummy");
  ppfStack_3a00 = (fdb_iterator **)0x11bc0a;
  system(acStack_3898);
  ppfStack_3a00 = (fdb_iterator **)0x11bc1d;
  fdb_open(&pfStack_39d0,"./dummy",&fStack_3790);
  ppfStack_3a00 = (fdb_iterator **)0x11bc30;
  fdb_kvs_open(pfStack_39d0,&pfStack_39d8,(char *)0x0,&fStack_38b0);
  uVar11 = 0;
  do {
    ppfStack_3a00 = (fdb_iterator **)0x11bc5c;
    sprintf((char *)apfStack_39b8,"k%06d\n",uVar11);
    ppfStack_3a00 = (fdb_iterator **)0x11bc6b;
    sprintf(acStack_3698,"v%06d\n",uVar11);
    ppfStack_3a00 = (fdb_iterator **)0x11bc86;
    fdb_set_kv(pfStack_39d8,apfStack_39b8,8,acStack_3698,8);
    uVar15 = (int)uVar11 + 1;
    uVar11 = (ulong)uVar15;
  } while (uVar15 != 3);
  ppfStack_3a00 = (fdb_iterator **)0x11bca8;
  sprintf((char *)apfStack_39b8,"k%06d\n",1);
  ppfStack_3a00 = (fdb_iterator **)0x11bcba;
  fdb_del_kv(pfStack_39d8,apfStack_39b8,8);
  ppfStack_3a00 = (fdb_iterator **)0x11bcc6;
  fdb_commit(pfStack_39d0,'\0');
  apfStack_39b8[0]._0_2_ = 0x61;
  acStack_3898[0] = 'z';
  acStack_3898[1] = '\0';
  ppfStack_3a00 = (fdb_iterator **)0x11bcfd;
  fVar2 = fdb_iterator_init(pfStack_39d8,&pfStack_39e8,apfStack_39b8,1,acStack_3898,1,2);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    ppfStack_3a00 = (fdb_iterator **)0x11bd0f;
    fVar2 = fdb_iterator_seek_to_max(pfStack_39e8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bf38;
    pfStack_39e0 = (fdb_doc *)0x0;
    ppfStack_3a00 = (fdb_iterator **)0x11bd2d;
    fVar2 = fdb_iterator_get(pfStack_39e8,&pfStack_39e0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bf3d;
    ppfStack_3a00 = (fdb_iterator **)0x11bd50;
    sprintf((char *)apfStack_39b8,"k%06d\n",2);
    if (*pfStack_39e0->key != CONCAT62(apfStack_39b8[0]._2_6_,apfStack_39b8[0]._0_2_))
    goto LAB_0011bf42;
    ppfStack_3a00 = (fdb_iterator **)0x11bd6a;
    fdb_doc_free(pfStack_39e0);
    ppfStack_3a00 = (fdb_iterator **)0x11bd74;
    fVar2 = fdb_iterator_prev(pfStack_39e8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bf4c;
    pfStack_39e0 = (fdb_doc *)0x0;
    ppfStack_3a00 = (fdb_iterator **)0x11bd92;
    fVar2 = fdb_iterator_get(pfStack_39e8,&pfStack_39e0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bf51;
    ppfStack_3a00 = (fdb_iterator **)0x11bdb2;
    sprintf((char *)apfStack_39b8,"k%06d\n",0);
    if (*pfStack_39e0->key != CONCAT62(apfStack_39b8[0]._2_6_,apfStack_39b8[0]._0_2_))
    goto LAB_0011bf56;
    ppfStack_3a00 = (fdb_iterator **)0x11bdcc;
    fdb_doc_free(pfStack_39e0);
    ppfVar6 = &pfStack_39e8;
    ppfStack_3a00 = (fdb_iterator **)0x11bdd9;
    fdb_iterator_close(pfStack_39e8);
    ppfStack_3a00 = (fdb_iterator **)0x11be05;
    fVar2 = fdb_iterator_init(pfStack_39d8,ppfVar6,apfStack_39b8,1,acStack_3898,1,2);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bf60;
    ppfStack_3a00 = (fdb_iterator **)0x11be17;
    fVar2 = fdb_iterator_seek_to_min(pfStack_39e8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bf65;
    pfStack_39e0 = (fdb_doc *)0x0;
    ppfStack_3a00 = (fdb_iterator **)0x11be35;
    fVar2 = fdb_iterator_get(pfStack_39e8,&pfStack_39e0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bf6a;
    ppfVar6 = apfStack_39b8;
    ppfStack_3a00 = (fdb_iterator **)0x11be55;
    sprintf((char *)ppfVar6,"k%06d\n",0);
    if (*pfStack_39e0->key != CONCAT62(apfStack_39b8[0]._2_6_,apfStack_39b8[0]._0_2_))
    goto LAB_0011bf6f;
    ppfStack_3a00 = (fdb_iterator **)0x11be6f;
    fdb_doc_free(pfStack_39e0);
    ppfStack_3a00 = (fdb_iterator **)0x11be79;
    fVar2 = fdb_iterator_next(pfStack_39e8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bf79;
    pfStack_39e0 = (fdb_doc *)0x0;
    ppfStack_3a00 = (fdb_iterator **)0x11be97;
    fVar2 = fdb_iterator_get(pfStack_39e8,&pfStack_39e0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bf7e;
    ppfVar6 = apfStack_39b8;
    ppfStack_3a00 = (fdb_iterator **)0x11beba;
    sprintf((char *)ppfVar6,"k%06d\n",2);
    if (*pfStack_39e0->key == CONCAT62(apfStack_39b8[0]._2_6_,apfStack_39b8[0]._0_2_)) {
      ppfStack_3a00 = (fdb_iterator **)0x11bed4;
      fdb_doc_free(pfStack_39e0);
      ppfStack_3a00 = (fdb_iterator **)0x11bede;
      fdb_iterator_close(pfStack_39e8);
      ppfStack_3a00 = (fdb_iterator **)0x11bee8;
      fdb_close(pfStack_39d0);
      ppfStack_3a00 = (fdb_iterator **)0x11beed;
      fdb_shutdown();
      ppfStack_3a00 = (fdb_iterator **)0x11bef2;
      memleak_end();
      pcVar16 = "%s PASSED\n";
      if (iterator_deleted_doc_right_before_the_end_test()::__test_pass != '\0') {
        pcVar16 = "%s FAILED\n";
      }
      ppfStack_3a00 = (fdb_iterator **)0x11bf23;
      fprintf(_stderr,pcVar16,"iterator deleted doc right before the end of iteration test");
      return;
    }
  }
  else {
    ppfStack_3a00 = (fdb_iterator **)0x11bf38;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf38:
    ppfStack_3a00 = (fdb_iterator **)0x11bf3d;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf3d:
    ppfStack_3a00 = (fdb_iterator **)0x11bf42;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf42:
    ppfStack_3a00 = (fdb_iterator **)0x11bf4c;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf4c:
    ppfStack_3a00 = (fdb_iterator **)0x11bf51;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf51:
    ppfStack_3a00 = (fdb_iterator **)0x11bf56;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf56:
    ppfVar6 = apfStack_39b8;
    ppfStack_3a00 = (fdb_iterator **)0x11bf60;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf60:
    ppfStack_3a00 = (fdb_iterator **)0x11bf65;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf65:
    ppfStack_3a00 = (fdb_iterator **)0x11bf6a;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf6a:
    ppfStack_3a00 = (fdb_iterator **)0x11bf6f;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf6f:
    ppfStack_3a00 = (fdb_iterator **)0x11bf79;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf79:
    ppfStack_3a00 = (fdb_iterator **)0x11bf7e;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf7e:
    ppfStack_3a00 = (fdb_iterator **)0x11bf83;
    iterator_deleted_doc_right_before_the_end_test();
  }
  ppfStack_3a00 = (fdb_iterator **)iterator_uncommited_seeks;
  iterator_deleted_doc_right_before_the_end_test();
  pcStack_3b58 = (code *)0x11bfa1;
  ppfStack_3a00 = ppfVar6;
  gettimeofday(&tStack_3b08,(__timezone_ptr_t)0x0);
  pfStack_3b40 = (fdb_doc *)0x0;
  pcStack_3b58 = (code *)0x11bfaf;
  memleak_start();
  pfVar14 = &fStack_3af8;
  pcStack_3b58 = (code *)0x11bfbc;
  fdb_get_default_config();
  pcStack_3b58 = (code *)0x11bfc6;
  fdb_get_default_kvs_config();
  pcStack_3b58 = (code *)0x11bfd2;
  system("rm -rf  iterator_test* > errorlog.txt");
  pcStack_3b58 = (code *)0x11bfe6;
  fVar2 = fdb_open(&pfStack_3b28,"./iterator_test1",pfVar14);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_3b58 = (code *)0x11c002;
    fVar2 = fdb_kvs_open_default(pfStack_3b28,&pfStack_3b30,&fStack_3b20);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c20d;
    pcStack_3b58 = (code *)0x11c025;
    fdb_set_kv(pfStack_3b30,"a",1,(void *)0x0,0);
    pfVar14 = (fdb_config *)0x154b95;
    pcStack_3b58 = (code *)0x11c043;
    fdb_set_kv(pfStack_3b30,"b",1,(void *)0x0,0);
    pcStack_3b58 = (code *)0x11c05e;
    fdb_set_kv(pfStack_3b30,"c",1,(void *)0x0,0);
    pcStack_3b58 = (code *)0x11c082;
    fVar2 = fdb_iterator_init(pfStack_3b30,&pfStack_3b38,"b",1,(void *)0x0,0,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c214;
    pcStack_3b58 = (code *)0x11c094;
    fVar2 = fdb_iterator_seek_to_min(pfStack_3b38);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c219;
    pcStack_3b58 = (code *)0x11c0ab;
    fVar2 = fdb_iterator_get(pfStack_3b38,&pfStack_3b40);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c220;
    if (*pfStack_3b40->key != 'b') goto LAB_0011c227;
    pcStack_3b58 = (code *)0x11c0ca;
    fdb_doc_free(pfStack_3b40);
    pfStack_3b40 = (fdb_doc *)0x0;
    pcStack_3b58 = (code *)0x11c0dd;
    fVar2 = fdb_iterator_seek_to_max(pfStack_3b38);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c22f;
    pcStack_3b58 = (code *)0x11c0f4;
    fVar2 = fdb_iterator_get(pfStack_3b38,&pfStack_3b40);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c236;
    if (*pfStack_3b40->key != 'c') goto LAB_0011c23d;
    pcStack_3b58 = (code *)0x11c113;
    fdb_doc_free(pfStack_3b40);
    pfStack_3b40 = (fdb_doc *)0x0;
    pcStack_3b58 = (code *)0x11c126;
    fVar2 = fdb_iterator_prev(pfStack_3b38);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c245;
    pcStack_3b58 = (code *)0x11c13d;
    fVar2 = fdb_iterator_get(pfStack_3b38,&pfStack_3b40);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c24c;
    if (*pfStack_3b40->key != 'b') goto LAB_0011c253;
    pcStack_3b58 = (code *)0x11c15c;
    fdb_doc_free(pfStack_3b40);
    pfStack_3b40 = (fdb_doc *)0x0;
    pcStack_3b58 = (code *)0x11c16f;
    fVar2 = fdb_iterator_next(pfStack_3b38);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c25b;
    pcStack_3b58 = (code *)0x11c186;
    fVar2 = fdb_iterator_get(pfStack_3b38,&pfStack_3b40);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c262;
    if (*pfStack_3b40->key == 'c') {
      pcStack_3b58 = (code *)0x11c1a5;
      fdb_doc_free(pfStack_3b40);
      pfStack_3b40 = (fdb_doc *)0x0;
      pcStack_3b58 = (code *)0x11c1b8;
      fdb_iterator_close(pfStack_3b38);
      pcStack_3b58 = (code *)0x11c1c2;
      fdb_close(pfStack_3b28);
      pcStack_3b58 = (code *)0x11c1c7;
      fdb_shutdown();
      pcStack_3b58 = (code *)0x11c1cc;
      memleak_end();
      pcVar16 = "%s PASSED\n";
      if (iterator_uncommited_seeks()::__test_pass != '\0') {
        pcVar16 = "%s FAILED\n";
      }
      pcStack_3b58 = (code *)0x11c1fd;
      fprintf(_stderr,pcVar16,"iterator single doc range");
      return;
    }
  }
  else {
    pcStack_3b58 = (code *)0x11c20d;
    iterator_uncommited_seeks();
LAB_0011c20d:
    pcStack_3b58 = (code *)0x11c214;
    iterator_uncommited_seeks();
LAB_0011c214:
    pcStack_3b58 = (code *)0x11c219;
    iterator_uncommited_seeks();
LAB_0011c219:
    pcStack_3b58 = (code *)0x11c220;
    iterator_uncommited_seeks();
LAB_0011c220:
    pcStack_3b58 = (code *)0x11c227;
    iterator_uncommited_seeks();
LAB_0011c227:
    pcStack_3b58 = (code *)0x11c22f;
    iterator_uncommited_seeks();
LAB_0011c22f:
    pcStack_3b58 = (code *)0x11c236;
    iterator_uncommited_seeks();
LAB_0011c236:
    pcStack_3b58 = (code *)0x11c23d;
    iterator_uncommited_seeks();
LAB_0011c23d:
    pcStack_3b58 = (code *)0x11c245;
    iterator_uncommited_seeks();
LAB_0011c245:
    pcStack_3b58 = (code *)0x11c24c;
    iterator_uncommited_seeks();
LAB_0011c24c:
    pcStack_3b58 = (code *)0x11c253;
    iterator_uncommited_seeks();
LAB_0011c253:
    pcStack_3b58 = (code *)0x11c25b;
    iterator_uncommited_seeks();
LAB_0011c25b:
    pcStack_3b58 = (code *)0x11c262;
    iterator_uncommited_seeks();
LAB_0011c262:
    pcStack_3b58 = (code *)0x11c269;
    iterator_uncommited_seeks();
  }
  pcStack_3b58 = iterator_init_using_substring_test;
  iterator_uncommited_seeks();
  pfStack_3f00 = (fdb_config *)0x11c28b;
  pfStack_3b68 = pfVar14;
  pcStack_3b60 = (char *)apfStack_39b8;
  pcStack_3b58 = (code *)uVar11;
  gettimeofday(&tStack_3e78,(__timezone_ptr_t)0x0);
  pfStack_3f00 = (fdb_config *)0x11c290;
  memleak_start();
  pfVar14 = &fStack_3d60;
  pfStack_3f00 = (fdb_config *)0x11c2a0;
  fdb_get_default_config();
  fStack_3d60.buffercache_size = 0;
  pfStack_3f00 = (fdb_config *)0x11c2b2;
  fdb_get_default_kvs_config();
  pfStack_3f00 = (fdb_config *)0x11c2d2;
  sprintf(acStack_3c68,"rm -rf  %s*","./iterator_test");
  pfStack_3f00 = (fdb_config *)0x11c2da;
  system(acStack_3c68);
  pfStack_3f00 = (fdb_config *)0x11c2ee;
  fVar2 = fdb_open(&pfStack_3ed8,"./iterator_test1",pfVar14);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfStack_3f00 = (fdb_config *)0x11c30c;
    fVar2 = fdb_kvs_open(pfStack_3ed8,&pfStack_3ee0,(char *)0x0,&fStack_3e90);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c4a6;
    uStack_3ea0 = 0x34323634353773;
    uStack_3e99 = 0xff;
    uStack_3eb8 = 0x34323634353773;
    uStack_3eb1 = 0x10000ff;
    uStack_3ea8._0_4_ = 0x34353773;
    uStack_3ea8._4_1_ = true;
    uStack_3ea8._5_1_ = true;
    uStack_3ea8._6_1_ = '4';
    uStack_3ea8._7_1_ = 0xff;
    uStack_3ec8 = 0xff34323634353773;
    uStack_3ec0 = 0xff;
    uStack_3e68 = 0x3179656b;
    uStack_3e64 = 0;
    pfStack_3f00 = (fdb_config *)0x11c370;
    fVar2 = fdb_set_kv(pfStack_3ee0,&uStack_3ea0,0xb,&uStack_3e68,4);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c4ab;
    uStack_3e64 = 0;
    uStack_3e68 = 0x3279656b;
    pfStack_3f00 = (fdb_config *)0x11c3a4;
    fVar2 = fdb_set_kv(pfStack_3ee0,&uStack_3eb8,0xb,&uStack_3e68,4);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c4b0;
    pfStack_3f00 = (fdb_config *)0x11c3bb;
    fVar2 = fdb_commit(pfStack_3ed8,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c4b5;
    pfStack_3f00 = (fdb_config *)0x11c3ee;
    fVar2 = fdb_iterator_init(pfStack_3ee0,&pfStack_3ee8,&uStack_3ea8,8,&uStack_3ec8,9,10);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c4ba;
    iVar3 = 0;
    pfVar14 = (fdb_config *)&pfStack_3ed0;
    do {
      pfStack_3ed0 = (fdb_doc *)0x0;
      pfStack_3f00 = (fdb_config *)0x11c413;
      fVar2 = fdb_iterator_get(pfStack_3ee8,(fdb_doc **)pfVar14);
      if (fVar2 != FDB_RESULT_SUCCESS) break;
      iVar3 = iVar3 + 1;
      pfStack_3f00 = (fdb_config *)0x11c423;
      fdb_doc_free(pfStack_3ed0);
      pfStack_3f00 = (fdb_config *)0x11c42d;
      fVar2 = fdb_iterator_next(pfStack_3ee8);
    } while (fVar2 == FDB_RESULT_SUCCESS);
    if (iVar3 != 2) goto LAB_0011c4bf;
    pfStack_3f00 = (fdb_config *)0x11c444;
    fVar2 = fdb_iterator_close(pfStack_3ee8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c4c4;
    pfStack_3f00 = (fdb_config *)0x11c452;
    fVar2 = fdb_close(pfStack_3ed8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c4c9;
    pfStack_3f00 = (fdb_config *)0x11c45b;
    fVar2 = fdb_shutdown();
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_3f00 = (fdb_config *)0x11c464;
      memleak_end();
      pcVar16 = "%s PASSED\n";
      if (iterator_init_using_substring_test()::__test_pass != '\0') {
        pcVar16 = "%s FAILED\n";
      }
      pfStack_3f00 = (fdb_config *)0x11c495;
      fprintf(_stderr,pcVar16,"iterator init using substring test");
      return;
    }
  }
  else {
    pfStack_3f00 = (fdb_config *)0x11c4a6;
    iterator_init_using_substring_test();
LAB_0011c4a6:
    pfStack_3f00 = (fdb_config *)0x11c4ab;
    iterator_init_using_substring_test();
LAB_0011c4ab:
    pfStack_3f00 = (fdb_config *)0x11c4b0;
    iterator_init_using_substring_test();
LAB_0011c4b0:
    pfStack_3f00 = (fdb_config *)0x11c4b5;
    iterator_init_using_substring_test();
LAB_0011c4b5:
    pfStack_3f00 = (fdb_config *)0x11c4ba;
    iterator_init_using_substring_test();
LAB_0011c4ba:
    pfStack_3f00 = (fdb_config *)0x11c4bf;
    iterator_init_using_substring_test();
LAB_0011c4bf:
    pfStack_3f00 = (fdb_config *)0x11c4c4;
    iterator_init_using_substring_test();
LAB_0011c4c4:
    pfStack_3f00 = (fdb_config *)0x11c4c9;
    iterator_init_using_substring_test();
LAB_0011c4c9:
    pfStack_3f00 = (fdb_config *)0x11c4ce;
    iterator_init_using_substring_test();
  }
  pfStack_3f00 = (fdb_config *)iterator_seek_to_max_key_with_deletes_test;
  iterator_init_using_substring_test();
  pfStack_4058 = (fdb_config *)0x11c4e9;
  pfStack_3f00 = pfVar14;
  gettimeofday(&tStack_4008,(__timezone_ptr_t)0x0);
  pfStack_4058 = (fdb_config *)0x11c4ee;
  memleak_start();
  pfStack_4040 = (fdb_iterator *)0x0;
  pfStack_4030 = (fdb_doc *)0x0;
  pfVar14 = &fStack_3ff8;
  pfStack_4058 = (fdb_config *)0x11c505;
  fdb_get_default_config();
  pfStack_4058 = (fdb_config *)0x11c50f;
  fdb_get_default_kvs_config();
  pfStack_4058 = (fdb_config *)0x11c51b;
  system("rm -rf  iterator_test* > errorlog.txt");
  pfStack_4058 = (fdb_config *)0x11c52f;
  fVar2 = fdb_open(&pfStack_4028,"./iterator_test1",pfVar14);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfStack_4058 = (fdb_config *)0x11c54b;
    fVar2 = fdb_kvs_open_default(pfStack_4028,&pfStack_4038,&fStack_4020);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c708;
    pfStack_4058 = (fdb_config *)0x11c56e;
    fdb_set_kv(pfStack_4038,"A",1,(void *)0x0,0);
    pfVar14 = (fdb_config *)0x154dcc;
    pfStack_4058 = (fdb_config *)0x11c58c;
    fdb_set_kv(pfStack_4038,"B",1,(void *)0x0,0);
    pfStack_4058 = (fdb_config *)0x11c5b7;
    fVar2 = fdb_iterator_init(pfStack_4038,&pfStack_4040,"B",1,"Bzz",3,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c70f;
    pfStack_4058 = (fdb_config *)0x11c5c9;
    fVar2 = fdb_iterator_seek_to_max(pfStack_4040);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c714;
    pfStack_4058 = (fdb_config *)0x11c5e0;
    fVar2 = fdb_iterator_get(pfStack_4040,&pfStack_4030);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c71b;
    if (*pfStack_4030->key != 'B') goto LAB_0011c722;
    pfStack_4058 = (fdb_config *)0x11c5ff;
    fdb_doc_free(pfStack_4030);
    pfStack_4030 = (fdb_doc *)0x0;
    pfStack_4058 = (fdb_config *)0x11c612;
    fVar2 = fdb_iterator_close(pfStack_4040);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c72a;
    pfStack_4040 = (fdb_iterator *)0x0;
    pfStack_4058 = (fdb_config *)0x11c639;
    fVar2 = fdb_del_kv(pfStack_4038,"B",1);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c731;
    pfStack_4058 = (fdb_config *)0x11c670;
    fVar2 = fdb_iterator_init(pfStack_4038,&pfStack_4040,"B",1,"Bzz",3,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c738;
    pfStack_4058 = (fdb_config *)0x11c687;
    fVar2 = fdb_iterator_get(pfStack_4040,&pfStack_4030);
    if (fVar2 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011c73d;
    pfStack_4058 = (fdb_config *)0x11c69a;
    fVar2 = fdb_iterator_seek_to_max(pfStack_4040);
    if (fVar2 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011c742;
    pfStack_4058 = (fdb_config *)0x11c6ad;
    fVar2 = fdb_close(pfStack_4028);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c747;
    pfStack_4058 = (fdb_config *)0x11c6ba;
    fVar2 = fdb_shutdown();
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_4058 = (fdb_config *)0x11c6c7;
      memleak_end();
      pcVar16 = "%s PASSED\n";
      if (iterator_seek_to_max_key_with_deletes_test()::__test_pass != '\0') {
        pcVar16 = "%s FAILED\n";
      }
      pfStack_4058 = (fdb_config *)0x11c6f8;
      fprintf(_stderr,pcVar16,"iterator seek to max test");
      return;
    }
  }
  else {
    pfStack_4058 = (fdb_config *)0x11c708;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c708:
    pfStack_4058 = (fdb_config *)0x11c70f;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c70f:
    pfStack_4058 = (fdb_config *)0x11c714;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c714:
    pfStack_4058 = (fdb_config *)0x11c71b;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c71b:
    pfStack_4058 = (fdb_config *)0x11c722;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c722:
    pfStack_4058 = (fdb_config *)0x11c72a;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c72a:
    pfStack_4058 = (fdb_config *)0x11c731;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c731:
    pfStack_4058 = (fdb_config *)0x11c738;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c738:
    pfStack_4058 = (fdb_config *)0x11c73d;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c73d:
    pfStack_4058 = (fdb_config *)0x11c742;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c742:
    pfStack_4058 = (fdb_config *)0x11c747;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c747:
    pfStack_4058 = (fdb_config *)0x11c74e;
    iterator_seek_to_max_key_with_deletes_test();
  }
  pfStack_4058 = (fdb_config *)iterator_seek_to_min_key_with_deletes_test;
  iterator_seek_to_max_key_with_deletes_test();
  pfStack_4058 = pfVar14;
  gettimeofday(&tStack_4160,(__timezone_ptr_t)0x0);
  memleak_start();
  pfStack_4198 = (fdb_iterator *)0x0;
  pfStack_4180 = (fdb_doc *)0x0;
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  system("rm -rf  iterator_test* > errorlog.txt");
  fVar2 = fdb_open(&pfStack_4188,"./iterator_test1",&fStack_4150);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_kvs_open_default(pfStack_4188,&pfStack_4190,&fStack_4178);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c8f5;
    fdb_set_kv(pfStack_4190,"B",1,(void *)0x0,0);
    fdb_set_kv(pfStack_4190,"C",1,(void *)0x0,0);
    fVar2 = fdb_del_kv(pfStack_4190,"B",1);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c8fc;
    fVar2 = fdb_iterator_init(pfStack_4190,&pfStack_4198,"A",1,"B",1,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c903;
    fVar2 = fdb_iterator_get(pfStack_4198,&pfStack_4180);
    if (fVar2 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011c908;
    fVar2 = fdb_iterator_seek_to_min(pfStack_4198);
    if (fVar2 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011c90d;
    fVar2 = fdb_iterator_close(pfStack_4198);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c912;
    fVar2 = fdb_close(pfStack_4188);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fVar2 = fdb_shutdown();
      if (fVar2 == FDB_RESULT_SUCCESS) {
        memleak_end();
        pcVar16 = "%s PASSED\n";
        if (iterator_seek_to_min_key_with_deletes_test()::__test_pass != '\0') {
          pcVar16 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar16,"iterator seek to min test");
        return;
      }
      goto LAB_0011c920;
    }
  }
  else {
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c8f5:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c8fc:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c903:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c908:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c90d:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c912:
    iterator_seek_to_min_key_with_deletes_test();
  }
  iterator_seek_to_min_key_with_deletes_test();
LAB_0011c920:
  iterator_seek_to_min_key_with_deletes_test();
  iterator_test();
  iterator_with_concurrent_updates_test();
  iterator_compact_uncommitted_db();
  iterator_seek_test();
  iVar3 = 0;
  do {
    iterator_complete_test(iVar3,0);
    iterator_complete_test(iVar3,1);
    iVar3 = iVar3 + 1;
  } while (iVar3 != 7);
  iterator_extreme_key_test();
  iterator_inmem_snapshot_seek_test(false);
  iterator_inmem_snapshot_seek_test(true);
  iterator_no_deletes_test();
  iterator_set_del_docs_test();
  iterator_del_next_test();
  sequence_iterator_test();
  sequence_iterator_duplicate_test();
  sequence_iterator_range_test();
  reverse_seek_to_max_nokey();
  reverse_sequence_iterator_test();
  reverse_sequence_iterator_kvs_test();
  reverse_iterator_test();
  iterator_seek_wal_only_test();
  iterator_after_wal_threshold();
  iterator_manual_wal_flush();
  sequence_iterator_seek_test(true);
  sequence_iterator_seek_test(false);
  iterator_concurrent_compaction();
  iterator_offset_access_test();
  iterator_deleted_doc_right_before_the_end_test();
  iterator_uncommited_seeks();
  iterator_init_using_substring_test();
  iterator_seek_to_max_key_with_deletes_test();
  iterator_seek_to_min_key_with_deletes_test();
  return;
}

Assistant:

void iterator_seek_wal_only_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db, *kv1;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;
    fdb_iterator *iterator;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous iterator_test files
    r = system(SHELL_DEL" iterator_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    // open db
    fdb_open(&dbfile, "./iterator_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "iterator_seek_wal_only_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Create another KV store..
    status = fdb_kvs_open(dbfile, &kv1, "kv1", &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert using 'kv1' instance to ensure it does not interfere
    for (i=0;i<n;++i){
        sprintf(keybuf, "kEy%d", i);
        sprintf(metabuf, "mEta%d", i);
        sprintf(bodybuf, "bOdy%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        status = fdb_set(kv1, doc[i]);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc[i]);
    }

    // insert all documents into WAL only
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }
    // commit without WAL flush
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // create an iterator for full range
    fdb_iterator_init(db, &iterator, NULL, 0, NULL, 0, FDB_ITR_NONE);

    // seek current iterator to inside the WAL's avl tree..
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[0]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[0]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[0]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // seek forward to 2nd key ..
    i=2;
    status = fdb_iterator_seek(iterator, doc[i]->key, strlen(keybuf), 0);
    TEST_CHK(status != FDB_RESULT_ITERATOR_FAIL);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // iterator should be able to proceed forward
    status = fdb_iterator_next(iterator);
    TEST_CHK(status != FDB_RESULT_ITERATOR_FAIL);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    i++;
    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // seek forward to the last key.
    status = fdb_iterator_seek(iterator, doc[n-1]->key, strlen(keybuf), 0);
    TEST_CHK(status != FDB_RESULT_ITERATOR_FAIL);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[n-1]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[n-1]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[n-1]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // seek backward to start key ..
    i = 0;
    status = fdb_iterator_seek(iterator, doc[i]->key, strlen(keybuf), 0);
    TEST_CHK(status != FDB_RESULT_ITERATOR_FAIL);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // seek forward to key2 ..
    status = fdb_iterator_seek(iterator, doc[2]->key, strlen(keybuf), 0);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    i=2;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
        TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);

        fdb_doc_free(rdoc);
        rdoc = NULL;
        i++;
    } while(fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
    TEST_CHK(i==10);

    // Seek backward again to a key...
    status = fdb_iterator_seek(iterator, doc[3]->key, strlen(keybuf), 0);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    i=3;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
        TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);

        fdb_doc_free(rdoc);
        rdoc = NULL;
        i++;
    } while (fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
    TEST_CHK(i==10);

    fdb_iterator_close(iterator);

    // Test fdb_iterator_seek_to_max with key range
    // create an iterator for range of doc[4] ~ doc[8]
    sprintf(keybuf, "key%d", 4); // reuse buffer for start key
    sprintf(metabuf, "key%d", 8); // reuse buffer for end_key
    status = fdb_iterator_init(db, &iterator, keybuf, strlen(keybuf),
                      metabuf, strlen(metabuf),
                      FDB_ITR_NO_DELETES);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    i = 8;
    status = fdb_iterator_seek_to_max(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // test fdb_iterator_seek_to_min
    i = 4;
    status = fdb_iterator_seek_to_min(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    status = fdb_iterator_close(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Test fdb_iterator_seek_to_max over full range
    status = fdb_iterator_init(db, &iterator, NULL, 0, NULL, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    i = n - 1;
    status = fdb_iterator_seek_to_max(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // test fdb_iterator_seek_to_min
    i = 0;
    status = fdb_iterator_seek_to_min(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    status = fdb_iterator_close(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // close the kvs kv1
    fdb_kvs_close(kv1);
    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("iterator seek wal only test");
}